

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  ulong uVar75;
  byte bVar76;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ulong uVar77;
  undefined8 in_R10;
  long lVar78;
  bool bVar79;
  uint uVar80;
  undefined1 auVar92 [16];
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float pp;
  float fVar141;
  float fVar142;
  undefined4 uVar143;
  float fVar159;
  float fVar160;
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar145 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar214 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 in_ZMM4 [64];
  float fVar226;
  undefined1 auVar224 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [64];
  undefined1 auVar227 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [64];
  float fVar233;
  float fVar238;
  undefined1 auVar234 [16];
  float fVar239;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  float fVar243;
  undefined1 auVar242 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_914;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  RTCFilterFunctionNArguments local_780;
  int local_74c;
  uint local_748;
  uint local_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined8 local_660;
  float local_658;
  float local_654;
  undefined4 local_650;
  uint local_64c;
  uint local_648;
  uint local_644;
  uint local_640;
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 auStack_490 [16];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar125 [32];
  
  uVar77 = (ulong)(byte)prim[1];
  fVar233 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar91 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  fVar179 = fVar233 * auVar91._0_4_;
  fVar141 = fVar233 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar83);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar84);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar89);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar88);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar77 * 0xc + 6);
  auVar101 = vpmovsxbd_avx2(auVar81);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar77 * 0xd + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar77 * 0x12 + 6);
  auVar102 = vpmovsxbd_avx2(auVar82);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar77 * 0x13 + 6);
  auVar103 = vpmovsxbd_avx2(auVar86);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar246 = ZEXT3264(auVar103);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar77 * 0x14 + 6);
  auVar105 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar105);
  auVar249 = ZEXT3264(auVar104);
  auVar114._4_4_ = fVar141;
  auVar114._0_4_ = fVar141;
  auVar114._8_4_ = fVar141;
  auVar114._12_4_ = fVar141;
  auVar114._16_4_ = fVar141;
  auVar114._20_4_ = fVar141;
  auVar114._24_4_ = fVar141;
  auVar114._28_4_ = fVar141;
  auVar116._8_4_ = 1;
  auVar116._0_8_ = 0x100000001;
  auVar116._12_4_ = 1;
  auVar116._16_4_ = 1;
  auVar116._20_4_ = 1;
  auVar116._24_4_ = 1;
  auVar116._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar233 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar233 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar233 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar141))));
  auVar106 = vpermps_avx2(auVar116,auVar95);
  auVar94 = vpermps_avx512vl(auVar93,auVar95);
  fVar141 = auVar94._0_4_;
  auVar225._0_4_ = fVar141 * auVar99._0_4_;
  fVar238 = auVar94._4_4_;
  auVar225._4_4_ = fVar238 * auVar99._4_4_;
  fVar239 = auVar94._8_4_;
  auVar225._8_4_ = fVar239 * auVar99._8_4_;
  fVar215 = auVar94._12_4_;
  auVar225._12_4_ = fVar215 * auVar99._12_4_;
  fVar216 = auVar94._16_4_;
  auVar225._16_4_ = fVar216 * auVar99._16_4_;
  fVar217 = auVar94._20_4_;
  auVar225._20_4_ = fVar217 * auVar99._20_4_;
  fVar164 = auVar94._24_4_;
  auVar225._28_36_ = in_ZMM4._28_36_;
  auVar225._24_4_ = fVar164 * auVar99._24_4_;
  auVar95._4_4_ = auVar97._4_4_ * fVar238;
  auVar95._0_4_ = auVar97._0_4_ * fVar141;
  auVar95._8_4_ = auVar97._8_4_ * fVar239;
  auVar95._12_4_ = auVar97._12_4_ * fVar215;
  auVar95._16_4_ = auVar97._16_4_ * fVar216;
  auVar95._20_4_ = auVar97._20_4_ * fVar217;
  auVar95._24_4_ = auVar97._24_4_ * fVar164;
  auVar95._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar104._4_4_ * fVar238;
  auVar105._0_4_ = auVar104._0_4_ * fVar141;
  auVar105._8_4_ = auVar104._8_4_ * fVar239;
  auVar105._12_4_ = auVar104._12_4_ * fVar215;
  auVar105._16_4_ = auVar104._16_4_ * fVar216;
  auVar105._20_4_ = auVar104._20_4_ * fVar217;
  auVar105._24_4_ = auVar104._24_4_ * fVar164;
  auVar105._28_4_ = auVar94._28_4_;
  auVar83 = vfmadd231ps_fma(auVar225._0_32_,auVar106,auVar96);
  auVar84 = vfmadd231ps_fma(auVar95,auVar106,auVar101);
  auVar89 = vfmadd231ps_fma(auVar105,auVar103,auVar106);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar114,auVar98);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar114,auVar100);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar102,auVar114);
  auVar115._4_4_ = fVar179;
  auVar115._0_4_ = fVar179;
  auVar115._8_4_ = fVar179;
  auVar115._12_4_ = fVar179;
  auVar115._16_4_ = fVar179;
  auVar115._20_4_ = fVar179;
  auVar115._24_4_ = fVar179;
  auVar115._28_4_ = fVar179;
  auVar106 = ZEXT1632(CONCAT412(fVar233 * auVar91._12_4_,
                                CONCAT48(fVar233 * auVar91._8_4_,
                                         CONCAT44(fVar233 * auVar91._4_4_,fVar179))));
  auVar105 = vpermps_avx2(auVar116,auVar106);
  auVar95 = vpermps_avx512vl(auVar93,auVar106);
  fVar233 = auVar95._0_4_;
  fVar141 = auVar95._4_4_;
  auVar106._4_4_ = fVar141 * auVar99._4_4_;
  auVar106._0_4_ = fVar233 * auVar99._0_4_;
  fVar238 = auVar95._8_4_;
  auVar106._8_4_ = fVar238 * auVar99._8_4_;
  fVar239 = auVar95._12_4_;
  auVar106._12_4_ = fVar239 * auVar99._12_4_;
  fVar215 = auVar95._16_4_;
  auVar106._16_4_ = fVar215 * auVar99._16_4_;
  fVar216 = auVar95._20_4_;
  auVar106._20_4_ = fVar216 * auVar99._20_4_;
  fVar217 = auVar95._24_4_;
  auVar106._24_4_ = fVar217 * auVar99._24_4_;
  auVar106._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar141;
  auVar93._0_4_ = auVar97._0_4_ * fVar233;
  auVar93._8_4_ = auVar97._8_4_ * fVar238;
  auVar93._12_4_ = auVar97._12_4_ * fVar239;
  auVar93._16_4_ = auVar97._16_4_ * fVar215;
  auVar93._20_4_ = auVar97._20_4_ * fVar216;
  auVar93._24_4_ = auVar97._24_4_ * fVar217;
  auVar93._28_4_ = auVar99._28_4_;
  auVar97._4_4_ = auVar104._4_4_ * fVar141;
  auVar97._0_4_ = auVar104._0_4_ * fVar233;
  auVar97._8_4_ = auVar104._8_4_ * fVar238;
  auVar97._12_4_ = auVar104._12_4_ * fVar239;
  auVar97._16_4_ = auVar104._16_4_ * fVar215;
  auVar97._20_4_ = auVar104._20_4_ * fVar216;
  auVar97._24_4_ = auVar104._24_4_ * fVar217;
  auVar97._28_4_ = auVar95._28_4_;
  auVar88 = vfmadd231ps_fma(auVar106,auVar105,auVar96);
  auVar81 = vfmadd231ps_fma(auVar93,auVar105,auVar101);
  auVar85 = vfmadd231ps_fma(auVar97,auVar105,auVar103);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar115,auVar98);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar115,auVar100);
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar115,auVar102);
  auVar98 = vandps_avx(ZEXT1632(auVar83),auVar111);
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar98,auVar113,1);
  bVar79 = (bool)((byte)uVar75 & 1);
  auVar94._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._0_4_;
  bVar79 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._4_4_;
  bVar79 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._8_4_;
  bVar79 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar84),auVar111);
  uVar75 = vcmpps_avx512vl(auVar98,auVar113,1);
  bVar79 = (bool)((byte)uVar75 & 1);
  auVar107._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._0_4_;
  bVar79 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._4_4_;
  bVar79 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._8_4_;
  bVar79 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar89),auVar111);
  uVar75 = vcmpps_avx512vl(auVar98,auVar113,1);
  bVar79 = (bool)((byte)uVar75 & 1);
  auVar98._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._0_4_;
  bVar79 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._4_4_;
  bVar79 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._8_4_;
  bVar79 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = 0x3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar94,auVar96,auVar112);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar107);
  auVar84 = vfnmadd213ps_fma(auVar107,auVar96,auVar112);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar89 = vfnmadd213ps_fma(auVar98,auVar96,auVar112);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar88));
  auVar102._4_4_ = auVar83._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar83._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar83._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar83._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar88));
  auVar110._0_4_ = auVar83._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar83._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar83._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar83._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar98._16_4_ * 0.0;
  auVar110._20_4_ = auVar98._20_4_ * 0.0;
  auVar110._24_4_ = auVar98._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0xe + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar81));
  auVar103._4_4_ = auVar84._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar84._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar84._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar84._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar97 = vpbroadcastd_avx512vl();
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar81));
  auVar109._0_4_ = auVar84._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar84._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar84._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar84._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x15 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar85));
  auVar104._4_4_ = auVar98._4_4_ * auVar89._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar89._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar89._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar89._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar85));
  auVar108._0_4_ = auVar89._0_4_ * auVar98._0_4_;
  auVar108._4_4_ = auVar89._4_4_ * auVar98._4_4_;
  auVar108._8_4_ = auVar89._8_4_ * auVar98._8_4_;
  auVar108._12_4_ = auVar89._12_4_ * auVar98._12_4_;
  auVar108._16_4_ = auVar98._16_4_ * 0.0;
  auVar108._20_4_ = auVar98._20_4_ * 0.0;
  auVar108._24_4_ = auVar98._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar110);
  auVar96 = vpminsd_avx2(auVar103,auVar109);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar108);
  uVar143 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar99._4_4_ = uVar143;
  auVar99._0_4_ = uVar143;
  auVar99._8_4_ = uVar143;
  auVar99._12_4_ = uVar143;
  auVar99._16_4_ = uVar143;
  auVar99._20_4_ = uVar143;
  auVar99._24_4_ = uVar143;
  auVar99._28_4_ = uVar143;
  auVar96 = vmaxps_avx512vl(auVar96,auVar99);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_2a0 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar110);
  auVar96 = vpmaxsd_avx2(auVar103,auVar109);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar108);
  fVar233 = (ray->super_RayK<1>).tfar;
  auVar100._4_4_ = fVar233;
  auVar100._0_4_ = fVar233;
  auVar100._8_4_ = fVar233;
  auVar100._12_4_ = fVar233;
  auVar100._16_4_ = fVar233;
  auVar100._20_4_ = fVar233;
  auVar100._24_4_ = fVar233;
  auVar100._28_4_ = fVar233;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar15 = vcmpps_avx512vl(local_2a0,auVar98,2);
  uVar18 = vpcmpgtd_avx512vl(auVar97,_DAT_01fb4ba0);
  local_628 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar18));
  local_630 = prim;
LAB_01a93255:
  local_74c = 1;
  if (local_628 == 0) {
    return;
  }
  lVar78 = 0;
  for (uVar75 = local_628; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar78 = lVar78 + 1;
  }
  local_910 = (ulong)*(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_908 = (ulong)*(uint *)(prim + lVar78 * 4 + 6);
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar78 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar78 = *(long *)&pGVar3[1].time_range.upper;
  auVar83 = *(undefined1 (*) [16])(lVar78 + (long)p_Var4 * uVar75);
  auVar84 = *(undefined1 (*) [16])(lVar78 + (uVar75 + 1) * (long)p_Var4);
  auVar89 = *(undefined1 (*) [16])(lVar78 + (uVar75 + 2) * (long)p_Var4);
  local_628 = local_628 - 1 & local_628;
  auVar88 = *(undefined1 (*) [16])(lVar78 + (uVar75 + 3) * (long)p_Var4);
  if (local_628 != 0) {
    uVar77 = local_628 - 1 & local_628;
    for (uVar75 = local_628; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar87._0_4_ = auVar83._0_4_ + auVar84._0_4_ + auVar89._0_4_ + auVar88._0_4_;
  auVar87._4_4_ = auVar83._4_4_ + auVar84._4_4_ + auVar89._4_4_ + auVar88._4_4_;
  auVar87._8_4_ = auVar83._8_4_ + auVar84._8_4_ + auVar89._8_4_ + auVar88._8_4_;
  auVar87._12_4_ = auVar83._12_4_ + auVar84._12_4_ + auVar89._12_4_ + auVar88._12_4_;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar87,auVar91);
  auVar81 = vsubps_avx(auVar81,(undefined1  [16])aVar1);
  auVar81 = vdpps_avx(auVar81,(undefined1  [16])aVar2,0x7f);
  auVar85 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar234._4_12_ = ZEXT812(0) << 0x20;
  auVar234._0_4_ = auVar85._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar234);
  auVar85 = vfnmadd213ss_fma(auVar82,auVar85,ZEXT416(0x40000000));
  fVar233 = auVar81._0_4_ * auVar82._0_4_ * auVar85._0_4_;
  local_530 = ZEXT416((uint)fVar233);
  auVar92._4_4_ = fVar233;
  auVar92._0_4_ = fVar233;
  auVar92._8_4_ = fVar233;
  auVar92._12_4_ = fVar233;
  fStack_410 = fVar233;
  _local_420 = auVar92;
  fStack_40c = fVar233;
  fStack_408 = fVar233;
  fStack_404 = fVar233;
  auVar81 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar92);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar89 = vsubps_avx(auVar89,auVar81);
  uVar143 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_3c0._4_4_ = uVar143;
  local_3c0._0_4_ = uVar143;
  local_3c0._8_4_ = uVar143;
  local_3c0._12_4_ = uVar143;
  local_3c0._16_4_ = uVar143;
  local_3c0._20_4_ = uVar143;
  local_3c0._24_4_ = uVar143;
  local_3c0._28_4_ = uVar143;
  auVar237 = ZEXT3264(local_3c0);
  uVar143 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_3e0._4_4_ = uVar143;
  local_3e0._0_4_ = uVar143;
  local_3e0._8_4_ = uVar143;
  local_3e0._12_4_ = uVar143;
  local_3e0._16_4_ = uVar143;
  local_3e0._20_4_ = uVar143;
  local_3e0._24_4_ = uVar143;
  local_3e0._28_4_ = uVar143;
  auVar240 = ZEXT3264(local_3e0);
  local_460 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar232 = ZEXT1664(auVar84);
  auVar88 = vsubps_avx(auVar88,auVar81);
  auVar225 = ZEXT1664(auVar88);
  local_7c0 = vbroadcastss_avx512vl(auVar83);
  auVar257 = ZEXT3264(local_7c0);
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  local_5a0 = ZEXT1632(auVar83);
  local_7e0 = vpermps_avx512vl(auVar118,local_5a0);
  auVar250 = ZEXT3264(local_7e0);
  auVar119._8_4_ = 2;
  auVar119._0_8_ = 0x200000002;
  auVar119._12_4_ = 2;
  auVar119._16_4_ = 2;
  auVar119._20_4_ = 2;
  auVar119._24_4_ = 2;
  auVar119._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar119,local_5a0);
  auVar251 = ZEXT3264(local_800);
  auVar122._8_4_ = 3;
  auVar122._0_8_ = 0x300000003;
  auVar122._12_4_ = 3;
  auVar122._16_4_ = 3;
  auVar122._20_4_ = 3;
  auVar122._24_4_ = 3;
  auVar122._28_4_ = 3;
  local_820 = vpermps_avx512vl(auVar122,local_5a0);
  auVar252 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(auVar84);
  auVar253 = ZEXT3264(local_840);
  local_5e0 = ZEXT1632(auVar84);
  local_860 = vpermps_avx512vl(auVar118,local_5e0);
  auVar254 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar119,local_5e0);
  auVar255 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar122,local_5e0);
  auVar256 = ZEXT3264(local_8a0);
  local_8c0 = vbroadcastss_avx512vl(auVar89);
  auVar258 = ZEXT3264(local_8c0);
  local_5c0 = ZEXT1632(auVar89);
  local_720 = vpermps_avx512vl(auVar118,local_5c0);
  auVar259 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar119,local_5c0);
  auVar260 = ZEXT3264(local_740);
  local_8e0 = vpermps_avx512vl(auVar122,local_5c0);
  auVar262 = ZEXT3264(local_8e0);
  local_220 = auVar88._0_4_;
  _local_600 = ZEXT1632(auVar88);
  local_240 = vpermps_avx512vl(auVar118,_local_600);
  local_200 = vpermps_avx512vl(auVar119,_local_600);
  local_280 = vpermps_avx2(auVar122,_local_600);
  auVar98 = vpermps_avx2(auVar119,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar83 = vfmadd231ps_fma(auVar98,local_3e0,local_3e0);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_3c0,local_3c0);
  local_1e0 = ZEXT1632(auVar83);
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar83),auVar117);
  uVar75 = 0;
  local_370 = ZEXT816(0x3f80000000000000);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar261 = ZEXT3264(auVar98);
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_260 = local_200;
  do {
    auVar83 = vmovshdup_avx(local_370);
    auVar83 = vsubps_avx(auVar83,local_370);
    auVar144._0_4_ = auVar83._0_4_;
    fVar14 = auVar144._0_4_ * 0.04761905;
    uVar143 = local_370._0_4_;
    local_6a0._4_4_ = uVar143;
    local_6a0._0_4_ = uVar143;
    local_6a0._8_4_ = uVar143;
    local_6a0._12_4_ = uVar143;
    local_6a0._16_4_ = uVar143;
    local_6a0._20_4_ = uVar143;
    local_6a0._24_4_ = uVar143;
    local_6a0._28_4_ = uVar143;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    local_700._16_4_ = auVar144._0_4_;
    local_700._0_16_ = auVar144;
    local_700._20_4_ = auVar144._0_4_;
    local_700._24_4_ = auVar144._0_4_;
    local_700._28_4_ = auVar144._0_4_;
    auVar83 = vfmadd231ps_fma(local_6a0,local_700,_DAT_01f7b040);
    auVar96 = vsubps_avx512vl(auVar261._0_32_,ZEXT1632(auVar83));
    fVar233 = auVar96._0_4_;
    fVar238 = auVar96._4_4_;
    fVar215 = auVar96._8_4_;
    fVar217 = auVar96._12_4_;
    fVar179 = auVar96._16_4_;
    fVar12 = auVar96._20_4_;
    fVar13 = auVar96._24_4_;
    fVar142 = fVar233 * fVar233 * fVar233;
    fVar159 = fVar238 * fVar238 * fVar238;
    auVar37._4_4_ = fVar159;
    auVar37._0_4_ = fVar142;
    fVar160 = fVar215 * fVar215 * fVar215;
    auVar37._8_4_ = fVar160;
    fVar161 = fVar217 * fVar217 * fVar217;
    auVar37._12_4_ = fVar161;
    fVar162 = fVar179 * fVar179 * fVar179;
    auVar37._16_4_ = fVar162;
    fVar163 = fVar12 * fVar12 * fVar12;
    auVar37._20_4_ = fVar163;
    fVar165 = fVar13 * fVar13 * fVar13;
    auVar37._24_4_ = fVar165;
    auVar37._28_4_ = auVar144._0_4_;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar37,auVar98);
    fVar141 = auVar83._0_4_;
    fVar239 = auVar83._4_4_;
    fVar216 = auVar83._8_4_;
    fVar164 = auVar83._12_4_;
    fVar180 = fVar141 * fVar141 * fVar141;
    fVar197 = fVar239 * fVar239 * fVar239;
    fVar198 = fVar216 * fVar216 * fVar216;
    fVar199 = fVar164 * fVar164 * fVar164;
    auVar241._0_4_ = fVar141 * fVar233;
    auVar241._4_4_ = fVar239 * fVar238;
    auVar241._8_4_ = fVar216 * fVar215;
    auVar241._12_4_ = fVar164 * fVar217;
    auVar241._16_4_ = fVar179 * 0.0;
    auVar241._20_4_ = fVar12 * 0.0;
    auVar241._28_36_ = auVar240._28_36_;
    auVar241._24_4_ = fVar13 * 0.0;
    auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar199,CONCAT48(fVar198,CONCAT44(fVar197,fVar180)
                                                                  ))),auVar98);
    fVar243 = auVar100._28_4_ + auVar144._0_4_;
    fVar226 = fVar243 + auVar246._28_4_ + auVar225._28_4_;
    auVar38._4_4_ = fVar159 * 0.16666667;
    auVar38._0_4_ = fVar142 * 0.16666667;
    auVar38._8_4_ = fVar160 * 0.16666667;
    auVar38._12_4_ = fVar161 * 0.16666667;
    auVar38._16_4_ = fVar162 * 0.16666667;
    auVar38._20_4_ = fVar163 * 0.16666667;
    auVar38._24_4_ = fVar165 * 0.16666667;
    auVar38._28_4_ = fVar243;
    auVar39._4_4_ =
         (auVar241._4_4_ * fVar238 * 12.0 + auVar241._4_4_ * fVar239 * 6.0 + fVar197 + auVar99._4_4_
         ) * 0.16666667;
    auVar39._0_4_ =
         (auVar241._0_4_ * fVar233 * 12.0 + auVar241._0_4_ * fVar141 * 6.0 + fVar180 + auVar99._0_4_
         ) * 0.16666667;
    auVar39._8_4_ =
         (auVar241._8_4_ * fVar215 * 12.0 + auVar241._8_4_ * fVar216 * 6.0 + fVar198 + auVar99._8_4_
         ) * 0.16666667;
    auVar39._12_4_ =
         (auVar241._12_4_ * fVar217 * 12.0 + auVar241._12_4_ * fVar164 * 6.0 +
         fVar199 + auVar99._12_4_) * 0.16666667;
    auVar39._16_4_ =
         (auVar241._16_4_ * fVar179 * 12.0 + auVar241._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar39._20_4_ =
         (auVar241._20_4_ * fVar12 * 12.0 + auVar241._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar39._24_4_ =
         (auVar241._24_4_ * fVar13 * 12.0 + auVar241._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar39._28_4_ = auVar246._28_4_;
    auVar40._4_4_ =
         (auVar100._4_4_ + fVar159 +
         auVar241._4_4_ * fVar239 * 12.0 + auVar241._4_4_ * fVar238 * 6.0) * 0.16666667;
    auVar40._0_4_ =
         (auVar100._0_4_ + fVar142 +
         auVar241._0_4_ * fVar141 * 12.0 + auVar241._0_4_ * fVar233 * 6.0) * 0.16666667;
    auVar40._8_4_ =
         (auVar100._8_4_ + fVar160 +
         auVar241._8_4_ * fVar216 * 12.0 + auVar241._8_4_ * fVar215 * 6.0) * 0.16666667;
    auVar40._12_4_ =
         (auVar100._12_4_ + fVar161 +
         auVar241._12_4_ * fVar164 * 12.0 + auVar241._12_4_ * fVar217 * 6.0) * 0.16666667;
    auVar40._16_4_ =
         (auVar100._16_4_ + fVar162 + auVar241._16_4_ * 0.0 * 12.0 + auVar241._16_4_ * fVar179 * 6.0
         ) * 0.16666667;
    auVar40._20_4_ =
         (auVar100._20_4_ + fVar163 + auVar241._20_4_ * 0.0 * 12.0 + auVar241._20_4_ * fVar12 * 6.0)
         * 0.16666667;
    auVar40._24_4_ =
         (auVar100._24_4_ + fVar165 + auVar241._24_4_ * 0.0 * 12.0 + auVar241._24_4_ * fVar13 * 6.0)
         * 0.16666667;
    auVar40._28_4_ = auVar249._28_4_;
    fVar180 = fVar180 * 0.16666667;
    fVar197 = fVar197 * 0.16666667;
    fVar198 = fVar198 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    auVar41._28_4_ = fVar226;
    auVar41._0_28_ = ZEXT1628(CONCAT412(fVar199,CONCAT48(fVar198,CONCAT44(fVar197,fVar180))));
    auVar42._4_4_ = fStack_21c * fVar197;
    auVar42._0_4_ = local_220 * fVar180;
    auVar42._8_4_ = fStack_218 * fVar198;
    auVar42._12_4_ = fStack_214 * fVar199;
    auVar42._16_4_ = fStack_210 * 0.0;
    auVar42._20_4_ = fStack_20c * 0.0;
    auVar42._24_4_ = fStack_208 * 0.0;
    auVar42._28_4_ = 0;
    auVar99 = vmulps_avx512vl(local_240,auVar41);
    auVar100 = vmulps_avx512vl(local_260,auVar41);
    auVar43._4_4_ = local_280._4_4_ * fVar197;
    auVar43._0_4_ = local_280._0_4_ * fVar180;
    auVar43._8_4_ = local_280._8_4_ * fVar198;
    auVar43._12_4_ = local_280._12_4_ * fVar199;
    auVar43._16_4_ = local_280._16_4_ * 0.0;
    auVar43._20_4_ = local_280._20_4_ * 0.0;
    auVar43._24_4_ = local_280._24_4_ * 0.0;
    auVar43._28_4_ = fVar226;
    auVar101 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar258._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar40,auVar259._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,auVar260._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar43,auVar262._0_32_,auVar40);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar39,auVar253._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar39,auVar254._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar39,auVar255._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar256._0_32_,auVar39);
    auVar102 = vfmadd231ps_avx512vl(auVar101,auVar38,auVar257._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar38,auVar250._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar100,auVar38,auVar251._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar97,auVar252._0_32_,auVar38);
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar100 = vxorps_avx512vl(auVar96,auVar105);
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar83),auVar105);
    auVar220._0_4_ = auVar101._0_4_ * fVar141;
    auVar220._4_4_ = auVar101._4_4_ * fVar239;
    auVar220._8_4_ = auVar101._8_4_ * fVar216;
    auVar220._12_4_ = auVar101._12_4_ * fVar164;
    auVar220._16_4_ = auVar101._16_4_ * 0.0;
    auVar220._20_4_ = auVar101._20_4_ * 0.0;
    auVar220._24_4_ = auVar101._24_4_ * 0.0;
    auVar220._28_4_ = 0;
    auVar101 = vmulps_avx512vl(auVar241._0_32_,auVar98);
    auVar98 = vsubps_avx(auVar220,auVar101);
    auVar44._4_4_ = auVar100._4_4_ * fVar238 * 0.5;
    auVar44._0_4_ = auVar100._0_4_ * fVar233 * 0.5;
    auVar44._8_4_ = auVar100._8_4_ * fVar215 * 0.5;
    auVar44._12_4_ = auVar100._12_4_ * fVar217 * 0.5;
    auVar44._16_4_ = auVar100._16_4_ * fVar179 * 0.5;
    auVar44._20_4_ = auVar100._20_4_ * fVar12 * 0.5;
    auVar44._24_4_ = auVar100._24_4_ * fVar13 * 0.5;
    auVar44._28_4_ = auVar96._28_4_;
    auVar45._4_4_ = auVar98._4_4_ * 0.5;
    auVar45._0_4_ = auVar98._0_4_ * 0.5;
    auVar45._8_4_ = auVar98._8_4_ * 0.5;
    auVar45._12_4_ = auVar98._12_4_ * 0.5;
    auVar45._16_4_ = auVar98._16_4_ * 0.5;
    auVar45._20_4_ = auVar98._20_4_ * 0.5;
    auVar45._24_4_ = auVar98._24_4_ * 0.5;
    auVar45._28_4_ = auVar98._28_4_;
    auVar46._4_4_ = (auVar101._4_4_ + fVar238 * fVar238) * 0.5;
    auVar46._0_4_ = (auVar101._0_4_ + fVar233 * fVar233) * 0.5;
    auVar46._8_4_ = (auVar101._8_4_ + fVar215 * fVar215) * 0.5;
    auVar46._12_4_ = (auVar101._12_4_ + fVar217 * fVar217) * 0.5;
    auVar46._16_4_ = (auVar101._16_4_ + fVar179 * fVar179) * 0.5;
    auVar46._20_4_ = (auVar101._20_4_ + fVar12 * fVar12) * 0.5;
    auVar46._24_4_ = (auVar101._24_4_ + fVar13 * fVar13) * 0.5;
    auVar46._28_4_ = auVar101._28_4_ + auVar232._28_4_;
    fVar233 = fVar141 * fVar141 * 0.5;
    fVar141 = fVar239 * fVar239 * 0.5;
    fVar238 = fVar216 * fVar216 * 0.5;
    fVar239 = fVar164 * fVar164 * 0.5;
    auVar47._28_4_ = auVar237._28_4_;
    auVar47._0_28_ = ZEXT1628(CONCAT412(fVar239,CONCAT48(fVar238,CONCAT44(fVar141,fVar233))));
    auVar48._4_4_ = fStack_21c * fVar141;
    auVar48._0_4_ = local_220 * fVar233;
    auVar48._8_4_ = fStack_218 * fVar238;
    auVar48._12_4_ = fStack_214 * fVar239;
    auVar48._16_4_ = fStack_210 * 0.0;
    auVar48._20_4_ = fStack_20c * 0.0;
    auVar48._24_4_ = fStack_208 * 0.0;
    auVar48._28_4_ = 0x3f000000;
    auVar98 = vmulps_avx512vl(local_240,auVar47);
    auVar96 = vmulps_avx512vl(local_260,auVar47);
    auVar49._4_4_ = fVar141 * local_280._4_4_;
    auVar49._0_4_ = fVar233 * local_280._0_4_;
    auVar49._8_4_ = fVar238 * local_280._8_4_;
    auVar49._12_4_ = fVar239 * local_280._12_4_;
    auVar49._16_4_ = local_280._16_4_ * 0.0;
    auVar49._20_4_ = local_280._20_4_ * 0.0;
    auVar49._24_4_ = local_280._24_4_ * 0.0;
    auVar49._28_4_ = auVar237._28_4_;
    auVar100 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar258._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar46,auVar259._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar46,auVar260._0_32_);
    auVar83 = vfmadd231ps_fma(auVar49,auVar262._0_32_,auVar46);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar45,auVar253._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar45,auVar254._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar45,auVar255._0_32_);
    auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar256._0_32_,auVar45);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar44,auVar257._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar44,auVar250._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar44,auVar251._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar252._0_32_,auVar44);
    auVar50._4_4_ = auVar100._4_4_ * fVar14;
    auVar50._0_4_ = auVar100._0_4_ * fVar14;
    auVar50._8_4_ = auVar100._8_4_ * fVar14;
    auVar50._12_4_ = auVar100._12_4_ * fVar14;
    auVar50._16_4_ = auVar100._16_4_ * fVar14;
    auVar50._20_4_ = auVar100._20_4_ * fVar14;
    auVar50._24_4_ = auVar100._24_4_ * fVar14;
    auVar50._28_4_ = auVar262._28_4_;
    auVar246 = ZEXT3264(auVar50);
    auVar51._4_4_ = auVar98._4_4_ * fVar14;
    auVar51._0_4_ = auVar98._0_4_ * fVar14;
    auVar51._8_4_ = auVar98._8_4_ * fVar14;
    auVar51._12_4_ = auVar98._12_4_ * fVar14;
    auVar51._16_4_ = auVar98._16_4_ * fVar14;
    auVar51._20_4_ = auVar98._20_4_ * fVar14;
    auVar51._24_4_ = auVar98._24_4_ * fVar14;
    auVar51._28_4_ = auVar249._28_4_;
    auVar249 = ZEXT3264(auVar51);
    auVar52._4_4_ = auVar96._4_4_ * fVar14;
    auVar52._0_4_ = auVar96._0_4_ * fVar14;
    auVar52._8_4_ = auVar96._8_4_ * fVar14;
    auVar52._12_4_ = auVar96._12_4_ * fVar14;
    auVar52._16_4_ = auVar96._16_4_ * fVar14;
    auVar52._20_4_ = auVar96._20_4_ * fVar14;
    auVar52._24_4_ = auVar96._24_4_ * fVar14;
    auVar52._28_4_ = auVar96._28_4_;
    fVar233 = auVar101._0_4_ * fVar14;
    fVar141 = auVar101._4_4_ * fVar14;
    auVar53._4_4_ = fVar141;
    auVar53._0_4_ = fVar233;
    fVar238 = auVar101._8_4_ * fVar14;
    auVar53._8_4_ = fVar238;
    fVar239 = auVar101._12_4_ * fVar14;
    auVar53._12_4_ = fVar239;
    fVar215 = auVar101._16_4_ * fVar14;
    auVar53._16_4_ = fVar215;
    fVar216 = auVar101._20_4_ * fVar14;
    auVar53._20_4_ = fVar216;
    fVar217 = auVar101._24_4_ * fVar14;
    auVar53._24_4_ = fVar217;
    auVar53._28_4_ = fVar14;
    auVar83 = vxorps_avx512vl(auVar261._0_16_,auVar261._0_16_);
    auVar106 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,ZEXT1632(auVar83));
    auVar237 = ZEXT3264(auVar106);
    auVar95 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,ZEXT1632(auVar83));
    auVar240 = ZEXT3264(auVar95);
    auVar100 = ZEXT1632(auVar83);
    auVar93 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar100);
    auVar221._0_4_ = fVar233 + auVar99._0_4_;
    auVar221._4_4_ = fVar141 + auVar99._4_4_;
    auVar221._8_4_ = fVar238 + auVar99._8_4_;
    auVar221._12_4_ = fVar239 + auVar99._12_4_;
    auVar221._16_4_ = fVar215 + auVar99._16_4_;
    auVar221._20_4_ = fVar216 + auVar99._20_4_;
    auVar221._24_4_ = fVar217 + auVar99._24_4_;
    auVar221._28_4_ = fVar14 + auVar99._28_4_;
    auVar98 = vmaxps_avx(auVar99,auVar221);
    auVar96 = vminps_avx(auVar99,auVar221);
    auVar94 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar100);
    auVar107 = vpermt2ps_avx512vl(auVar50,_DAT_01fb9fc0,auVar100);
    auVar108 = vpermt2ps_avx512vl(auVar51,_DAT_01fb9fc0,auVar100);
    auVar119 = ZEXT1632(auVar83);
    auVar109 = vpermt2ps_avx512vl(auVar52,_DAT_01fb9fc0,auVar119);
    auVar99 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,auVar119);
    auVar99 = vsubps_avx(auVar94,auVar99);
    auVar100 = vsubps_avx(auVar106,auVar102);
    auVar232 = ZEXT3264(auVar100);
    auVar101 = vsubps_avx(auVar95,auVar103);
    auVar97 = vsubps_avx(auVar93,auVar104);
    auVar225 = ZEXT3264(auVar97);
    auVar110 = vmulps_avx512vl(auVar101,auVar52);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar51,auVar97);
    auVar111 = vmulps_avx512vl(auVar97,auVar50);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar52,auVar100);
    auVar112 = vmulps_avx512vl(auVar100,auVar51);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar50,auVar101);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar97,auVar97);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar101);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,auVar100);
    auVar112 = vrcp14ps_avx512vl(auVar111);
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar114 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar113);
    auVar112 = vfmadd132ps_avx512vl(auVar114,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar110,auVar112);
    auVar114 = vmulps_avx512vl(auVar101,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar108,auVar97);
    auVar115 = vmulps_avx512vl(auVar97,auVar107);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar100);
    auVar116 = vmulps_avx512vl(auVar100,auVar108);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar107,auVar101);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar114,auVar112);
    auVar110 = vmaxps_avx512vl(auVar110,auVar112);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar112 = vmaxps_avx512vl(auVar99,auVar94);
    auVar98 = vmaxps_avx512vl(auVar98,auVar112);
    auVar112 = vaddps_avx512vl(auVar110,auVar98);
    auVar98 = vminps_avx(auVar99,auVar94);
    auVar98 = vminps_avx(auVar96,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar110);
    auVar123._8_4_ = 0x3f800002;
    auVar123._0_8_ = 0x3f8000023f800002;
    auVar123._12_4_ = 0x3f800002;
    auVar123._16_4_ = 0x3f800002;
    auVar123._20_4_ = 0x3f800002;
    auVar123._24_4_ = 0x3f800002;
    auVar123._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar112,auVar123);
    auVar124._8_4_ = 0x3f7ffffc;
    auVar124._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar124._12_4_ = 0x3f7ffffc;
    auVar124._16_4_ = 0x3f7ffffc;
    auVar124._20_4_ = 0x3f7ffffc;
    auVar124._24_4_ = 0x3f7ffffc;
    auVar124._28_4_ = 0x3f7ffffc;
    local_900 = vmulps_avx512vl(auVar98,auVar124);
    auVar98 = vmulps_avx512vl(auVar96,auVar96);
    auVar96 = vrsqrt14ps_avx512vl(auVar111);
    auVar26._8_4_ = 0xbf000000;
    auVar26._0_8_ = 0xbf000000bf000000;
    auVar26._12_4_ = 0xbf000000;
    auVar26._16_4_ = 0xbf000000;
    auVar26._20_4_ = 0xbf000000;
    auVar26._24_4_ = 0xbf000000;
    auVar26._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar111,auVar26);
    fVar233 = auVar96._0_4_;
    fVar141 = auVar96._4_4_;
    fVar238 = auVar96._8_4_;
    fVar239 = auVar96._12_4_;
    fVar215 = auVar96._16_4_;
    fVar216 = auVar96._20_4_;
    fVar217 = auVar96._24_4_;
    auVar54._4_4_ = fVar141 * fVar141 * fVar141 * auVar99._4_4_;
    auVar54._0_4_ = fVar233 * fVar233 * fVar233 * auVar99._0_4_;
    auVar54._8_4_ = fVar238 * fVar238 * fVar238 * auVar99._8_4_;
    auVar54._12_4_ = fVar239 * fVar239 * fVar239 * auVar99._12_4_;
    auVar54._16_4_ = fVar215 * fVar215 * fVar215 * auVar99._16_4_;
    auVar54._20_4_ = fVar216 * fVar216 * fVar216 * auVar99._20_4_;
    auVar54._24_4_ = fVar217 * fVar217 * fVar217 * auVar99._24_4_;
    auVar54._28_4_ = auVar112._28_4_;
    auVar27._8_4_ = 0x3fc00000;
    auVar27._0_8_ = 0x3fc000003fc00000;
    auVar27._12_4_ = 0x3fc00000;
    auVar27._16_4_ = 0x3fc00000;
    auVar27._20_4_ = 0x3fc00000;
    auVar27._24_4_ = 0x3fc00000;
    auVar27._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar54,auVar96,auVar27);
    auVar99 = vmulps_avx512vl(auVar100,auVar96);
    auVar94 = vmulps_avx512vl(auVar101,auVar96);
    auVar110 = vmulps_avx512vl(auVar97,auVar96);
    auVar111 = vsubps_avx512vl(auVar119,auVar102);
    auVar112 = vsubps_avx512vl(auVar119,auVar103);
    auVar114 = vsubps_avx512vl(auVar119,auVar104);
    auVar67._4_4_ = uStack_45c;
    auVar67._0_4_ = local_460;
    auVar67._8_4_ = uStack_458;
    auVar67._12_4_ = uStack_454;
    auVar67._16_4_ = uStack_450;
    auVar67._20_4_ = uStack_44c;
    auVar67._24_4_ = uStack_448;
    auVar67._28_4_ = uStack_444;
    auVar115 = vmulps_avx512vl(auVar67,auVar114);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_3e0,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_3c0,auVar111);
    auVar116 = vmulps_avx512vl(auVar114,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,auVar111);
    auVar117 = vmulps_avx512vl(auVar67,auVar110);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar94,local_3e0);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar99,local_3c0);
    auVar110 = vmulps_avx512vl(auVar114,auVar110);
    auVar94 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar94);
    auVar99 = vfmadd231ps_avx512vl(auVar94,auVar111,auVar99);
    auVar94 = vmulps_avx512vl(auVar117,auVar117);
    auVar110 = vsubps_avx512vl(local_1e0,auVar94);
    auVar118 = vmulps_avx512vl(auVar117,auVar99);
    auVar115 = vsubps_avx512vl(auVar115,auVar118);
    auVar115 = vaddps_avx512vl(auVar115,auVar115);
    auVar118 = vmulps_avx512vl(auVar99,auVar99);
    local_620 = vsubps_avx512vl(auVar116,auVar118);
    auVar98 = vsubps_avx512vl(local_620,auVar98);
    local_560 = vmulps_avx512vl(auVar115,auVar115);
    auVar28._8_4_ = 0x40800000;
    auVar28._0_8_ = 0x4080000040800000;
    auVar28._12_4_ = 0x40800000;
    auVar28._16_4_ = 0x40800000;
    auVar28._20_4_ = 0x40800000;
    auVar28._24_4_ = 0x40800000;
    auVar28._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar110,auVar28);
    auVar116 = vmulps_avx512vl(_local_580,auVar98);
    auVar116 = vsubps_avx512vl(local_560,auVar116);
    uVar77 = vcmpps_avx512vl(auVar116,auVar119,5);
    bVar72 = (byte)uVar77;
    if (bVar72 == 0) {
      auVar261 = ZEXT3264(auVar113);
LAB_01a93f07:
      auVar257 = ZEXT3264(local_7c0);
      auVar250 = ZEXT3264(local_7e0);
      auVar251 = ZEXT3264(local_800);
      auVar252 = ZEXT3264(local_820);
      auVar253 = ZEXT3264(local_840);
      auVar254 = ZEXT3264(local_860);
      auVar255 = ZEXT3264(local_880);
      auVar256 = ZEXT3264(local_8a0);
      auVar258 = ZEXT3264(local_8c0);
      auVar259 = ZEXT3264(local_720);
      auVar260 = ZEXT3264(local_740);
      auVar262 = ZEXT3264(local_8e0);
    }
    else {
      auVar118 = _local_580;
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar119 = vaddps_avx512vl(auVar110,auVar110);
      local_480 = vrcp14ps_avx512vl(auVar119);
      auVar113 = vfnmadd213ps_avx512vl(local_480,auVar119,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_480,local_480);
      local_6e0 = vxorps_avx512vl(auVar115,auVar105);
      auVar105 = vsubps_avx512vl(local_6e0,auVar116);
      auVar105 = vmulps_avx512vl(auVar105,auVar113);
      auVar116 = vsubps_avx512vl(auVar116,auVar115);
      local_6c0 = vmulps_avx512vl(auVar116,auVar113);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar116,auVar105);
      auVar120._0_4_ =
           (uint)(bVar72 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar113._0_4_;
      bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar79 * auVar116._4_4_ | (uint)!bVar79 * auVar113._4_4_;
      bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar79 * auVar116._8_4_ | (uint)!bVar79 * auVar113._8_4_;
      bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar79 * auVar116._12_4_ | (uint)!bVar79 * auVar113._12_4_;
      bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar79 * auVar116._16_4_ | (uint)!bVar79 * auVar113._16_4_;
      bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar79 * auVar116._20_4_ | (uint)!bVar79 * auVar113._20_4_;
      bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar79 * auVar116._24_4_ | (uint)!bVar79 * auVar113._24_4_;
      bVar79 = SUB81(uVar77 >> 7,0);
      auVar120._28_4_ = (uint)bVar79 * auVar116._28_4_ | (uint)!bVar79 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar113,local_6c0);
      auVar121._0_4_ =
           (uint)(bVar72 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar113._0_4_;
      bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar79 * auVar116._4_4_ | (uint)!bVar79 * auVar113._4_4_;
      bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar79 * auVar116._8_4_ | (uint)!bVar79 * auVar113._8_4_;
      bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar79 * auVar116._12_4_ | (uint)!bVar79 * auVar113._12_4_;
      bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar79 * auVar116._16_4_ | (uint)!bVar79 * auVar113._16_4_;
      bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar79 * auVar116._20_4_ | (uint)!bVar79 * auVar113._20_4_;
      bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar79 * auVar116._24_4_ | (uint)!bVar79 * auVar113._24_4_;
      bVar79 = SUB81(uVar77 >> 7,0);
      auVar121._28_4_ = (uint)bVar79 * auVar116._28_4_ | (uint)!bVar79 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar94,auVar113);
      _local_4a0 = vmaxps_avx512vl(local_200,auVar113);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      local_4c0 = vmulps_avx512vl(_local_4a0,auVar29);
      vandps_avx512vl(auVar110,auVar113);
      uVar16 = vcmpps_avx512vl(local_4c0,local_4c0,1);
      uVar77 = uVar77 & uVar16;
      bVar76 = (byte)uVar77;
      if (bVar76 != 0) {
        uVar16 = vcmpps_avx512vl(auVar98,_DAT_01f7b000,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar110 = vblendmps_avx512vl(auVar98,auVar94);
        bVar74 = (byte)uVar16;
        uVar80 = (uint)(bVar74 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar74 & 1) * local_4c0._0_4_;
        bVar79 = (bool)((byte)(uVar16 >> 1) & 1);
        uVar134 = (uint)bVar79 * auVar110._4_4_ | (uint)!bVar79 * local_4c0._4_4_;
        bVar79 = (bool)((byte)(uVar16 >> 2) & 1);
        uVar135 = (uint)bVar79 * auVar110._8_4_ | (uint)!bVar79 * local_4c0._8_4_;
        bVar79 = (bool)((byte)(uVar16 >> 3) & 1);
        uVar136 = (uint)bVar79 * auVar110._12_4_ | (uint)!bVar79 * local_4c0._12_4_;
        bVar79 = (bool)((byte)(uVar16 >> 4) & 1);
        uVar137 = (uint)bVar79 * auVar110._16_4_ | (uint)!bVar79 * local_4c0._16_4_;
        bVar79 = (bool)((byte)(uVar16 >> 5) & 1);
        uVar138 = (uint)bVar79 * auVar110._20_4_ | (uint)!bVar79 * local_4c0._20_4_;
        bVar79 = (bool)((byte)(uVar16 >> 6) & 1);
        uVar139 = (uint)bVar79 * auVar110._24_4_ | (uint)!bVar79 * local_4c0._24_4_;
        bVar79 = SUB81(uVar16 >> 7,0);
        uVar140 = (uint)bVar79 * auVar110._28_4_ | (uint)!bVar79 * local_4c0._28_4_;
        auVar120._0_4_ = (bVar76 & 1) * uVar80 | !(bool)(bVar76 & 1) * auVar120._0_4_;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar120._4_4_ = bVar79 * uVar134 | !bVar79 * auVar120._4_4_;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar120._8_4_ = bVar79 * uVar135 | !bVar79 * auVar120._8_4_;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar120._12_4_ = bVar79 * uVar136 | !bVar79 * auVar120._12_4_;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar120._16_4_ = bVar79 * uVar137 | !bVar79 * auVar120._16_4_;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar120._20_4_ = bVar79 * uVar138 | !bVar79 * auVar120._20_4_;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar120._24_4_ = bVar79 * uVar139 | !bVar79 * auVar120._24_4_;
        bVar79 = SUB81(uVar77 >> 7,0);
        auVar120._28_4_ = bVar79 * uVar140 | !bVar79 * auVar120._28_4_;
        auVar98 = vblendmps_avx512vl(auVar94,auVar98);
        bVar79 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar16 >> 6) & 1);
        bVar11 = SUB81(uVar16 >> 7,0);
        auVar121._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar74 & 1) * auVar98._0_4_ | !(bool)(bVar74 & 1) * uVar80) |
             !(bool)(bVar76 & 1) * auVar121._0_4_;
        bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar121._4_4_ =
             (uint)bVar5 * ((uint)bVar79 * auVar98._4_4_ | !bVar79 * uVar134) |
             !bVar5 * auVar121._4_4_;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar121._8_4_ =
             (uint)bVar79 * ((uint)bVar6 * auVar98._8_4_ | !bVar6 * uVar135) |
             !bVar79 * auVar121._8_4_;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar121._12_4_ =
             (uint)bVar79 * ((uint)bVar7 * auVar98._12_4_ | !bVar7 * uVar136) |
             !bVar79 * auVar121._12_4_;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar121._16_4_ =
             (uint)bVar79 * ((uint)bVar8 * auVar98._16_4_ | !bVar8 * uVar137) |
             !bVar79 * auVar121._16_4_;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar121._20_4_ =
             (uint)bVar79 * ((uint)bVar9 * auVar98._20_4_ | !bVar9 * uVar138) |
             !bVar79 * auVar121._20_4_;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar121._24_4_ =
             (uint)bVar79 * ((uint)bVar10 * auVar98._24_4_ | !bVar10 * uVar139) |
             !bVar79 * auVar121._24_4_;
        bVar79 = SUB81(uVar77 >> 7,0);
        auVar121._28_4_ =
             (uint)bVar79 * ((uint)bVar11 * auVar98._28_4_ | !bVar11 * uVar140) |
             !bVar79 * auVar121._28_4_;
        bVar72 = (~bVar76 | bVar74) & bVar72;
      }
      auVar68._4_4_ = uStack_45c;
      auVar68._0_4_ = local_460;
      auVar68._8_4_ = uStack_458;
      auVar68._12_4_ = uStack_454;
      auVar68._16_4_ = uStack_450;
      auVar68._20_4_ = uStack_44c;
      auVar68._24_4_ = uStack_448;
      auVar68._28_4_ = uStack_444;
      if ((bVar72 & 0x7f) == 0) {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar98);
        goto LAB_01a93f07;
      }
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar109 = vxorps_avx512vl(auVar109,auVar94);
      auVar107 = vxorps_avx512vl(auVar107,auVar94);
      auVar108 = vxorps_avx512vl(auVar108,auVar94);
      auVar83 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_530);
      auVar98 = vbroadcastss_avx512vl(auVar83);
      auVar110 = vmaxps_avx512vl(auVar98,auVar120);
      auVar83 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_530);
      auVar98 = vbroadcastss_avx512vl(auVar83);
      auVar113 = vminps_avx512vl(auVar98,auVar121);
      auVar98 = vmulps_avx512vl(auVar52,auVar114);
      auVar98 = vfmadd213ps_avx512vl(auVar112,auVar51,auVar98);
      auVar83 = vfmadd213ps_fma(auVar111,auVar50,auVar98);
      auVar98 = vmulps_avx512vl(auVar68,auVar52);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_3e0,auVar51);
      auVar111 = vfmadd231ps_avx512vl(auVar98,local_3c0,auVar50);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar244,auVar111);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar98,auVar112,1);
      auVar98 = vxorps_avx512vl(ZEXT1632(auVar83),auVar94);
      auVar114 = vrcp14ps_avx512vl(auVar111);
      auVar116 = vxorps_avx512vl(auVar111,auVar94);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar123 = vfnmadd213ps_avx512vl(auVar114,auVar111,auVar122);
      auVar83 = vfmadd132ps_fma(auVar123,auVar114,auVar114);
      fVar233 = auVar83._0_4_ * auVar98._0_4_;
      fVar141 = auVar83._4_4_ * auVar98._4_4_;
      auVar55._4_4_ = fVar141;
      auVar55._0_4_ = fVar233;
      fVar238 = auVar83._8_4_ * auVar98._8_4_;
      auVar55._8_4_ = fVar238;
      fVar239 = auVar83._12_4_ * auVar98._12_4_;
      auVar55._12_4_ = fVar239;
      fVar215 = auVar98._16_4_ * 0.0;
      auVar55._16_4_ = fVar215;
      fVar216 = auVar98._20_4_ * 0.0;
      auVar55._20_4_ = fVar216;
      fVar217 = auVar98._24_4_ * 0.0;
      auVar55._24_4_ = fVar217;
      auVar55._28_4_ = auVar98._28_4_;
      uVar18 = vcmpps_avx512vl(auVar111,auVar116,1);
      bVar76 = (byte)uVar15 | (byte)uVar18;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar55,auVar123);
      auVar125._0_4_ =
           (uint)(bVar76 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar114._0_4_;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar79 * auVar124._4_4_ | (uint)!bVar79 * auVar114._4_4_;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar79 * auVar124._8_4_ | (uint)!bVar79 * auVar114._8_4_;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar79 * auVar124._12_4_ | (uint)!bVar79 * auVar114._12_4_;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar79 * auVar124._16_4_ | (uint)!bVar79 * auVar114._16_4_;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar79 * auVar124._20_4_ | (uint)!bVar79 * auVar114._20_4_;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar79 * auVar124._24_4_ | (uint)!bVar79 * auVar114._24_4_;
      auVar125._28_4_ =
           (uint)(bVar76 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar114._28_4_;
      auVar110 = vmaxps_avx512vl(auVar110,auVar125);
      auVar246 = ZEXT3264(auVar110);
      uVar18 = vcmpps_avx512vl(auVar111,auVar116,6);
      bVar76 = (byte)uVar15 | (byte)uVar18;
      auVar126._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar233;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar141;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar238;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar239;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar215;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar216;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar217;
      auVar126._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar98._28_4_;
      auVar98 = vminps_avx512vl(auVar113,auVar126);
      auVar83 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
      auVar106 = vsubps_avx512vl(ZEXT1632(auVar83),auVar106);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar83),auVar95);
      auVar111 = ZEXT1632(auVar83);
      auVar93 = vsubps_avx512vl(auVar111,auVar93);
      auVar93 = vmulps_avx512vl(auVar93,auVar109);
      auVar95 = vfmadd231ps_avx512vl(auVar93,auVar108,auVar95);
      auVar106 = vfmadd231ps_avx512vl(auVar95,auVar107,auVar106);
      auVar95 = vmulps_avx512vl(auVar68,auVar109);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_3e0,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_3c0,auVar107);
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar30._16_4_ = 0x7fffffff;
      auVar30._20_4_ = 0x7fffffff;
      auVar30._24_4_ = 0x7fffffff;
      auVar30._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar95,auVar30);
      uVar15 = vcmpps_avx512vl(auVar95,auVar112,1);
      auVar106 = vxorps_avx512vl(auVar106,auVar94);
      auVar93 = vrcp14ps_avx512vl(auVar95);
      auVar94 = vxorps_avx512vl(auVar95,auVar94);
      auVar107 = vfnmadd213ps_avx512vl(auVar93,auVar95,auVar122);
      auVar83 = vfmadd132ps_fma(auVar107,auVar93,auVar93);
      auVar249 = ZEXT1664(auVar83);
      fVar233 = auVar83._0_4_ * auVar106._0_4_;
      fVar141 = auVar83._4_4_ * auVar106._4_4_;
      auVar56._4_4_ = fVar141;
      auVar56._0_4_ = fVar233;
      fVar238 = auVar83._8_4_ * auVar106._8_4_;
      auVar56._8_4_ = fVar238;
      fVar239 = auVar83._12_4_ * auVar106._12_4_;
      auVar56._12_4_ = fVar239;
      fVar215 = auVar106._16_4_ * 0.0;
      auVar56._16_4_ = fVar215;
      fVar216 = auVar106._20_4_ * 0.0;
      auVar56._20_4_ = fVar216;
      fVar217 = auVar106._24_4_ * 0.0;
      auVar56._24_4_ = fVar217;
      auVar56._28_4_ = auVar106._28_4_;
      uVar18 = vcmpps_avx512vl(auVar95,auVar94,1);
      bVar76 = (byte)uVar15 | (byte)uVar18;
      auVar107 = vblendmps_avx512vl(auVar56,auVar123);
      auVar127._0_4_ =
           (uint)(bVar76 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar93._0_4_;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar79 * auVar107._4_4_ | (uint)!bVar79 * auVar93._4_4_;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar79 * auVar107._8_4_ | (uint)!bVar79 * auVar93._8_4_;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar79 * auVar107._12_4_ | (uint)!bVar79 * auVar93._12_4_;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar79 * auVar107._16_4_ | (uint)!bVar79 * auVar93._16_4_;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar79 * auVar107._20_4_ | (uint)!bVar79 * auVar93._20_4_;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar79 * auVar107._24_4_ | (uint)!bVar79 * auVar93._24_4_;
      auVar127._28_4_ =
           (uint)(bVar76 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar93._28_4_;
      local_440 = vmaxps_avx(auVar110,auVar127);
      auVar240 = ZEXT3264(local_440);
      uVar18 = vcmpps_avx512vl(auVar95,auVar94,6);
      bVar76 = (byte)uVar15 | (byte)uVar18;
      auVar128._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar233;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar141;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar238;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar239;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar215;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar216;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar217;
      auVar128._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar106._28_4_;
      local_2e0 = vminps_avx(auVar98,auVar128);
      auVar237 = ZEXT3264(local_2e0);
      uVar15 = vcmpps_avx512vl(local_440,local_2e0,2);
      bVar72 = bVar72 & 0x7f & (byte)uVar15;
      if (bVar72 == 0) {
        auVar261 = ZEXT3264(auVar122);
        goto LAB_01a93f07;
      }
      auVar95 = vmaxps_avx512vl(auVar111,local_900);
      auVar98 = vfmadd213ps_avx512vl(auVar105,auVar117,auVar99);
      auVar98 = vmulps_avx512vl(auVar96,auVar98);
      auVar105 = vfmadd213ps_avx512vl(local_6c0,auVar117,auVar99);
      fVar233 = auVar96._0_4_;
      fVar141 = auVar96._4_4_;
      auVar57._4_4_ = fVar141 * auVar105._4_4_;
      auVar57._0_4_ = fVar233 * auVar105._0_4_;
      fVar238 = auVar96._8_4_;
      auVar57._8_4_ = fVar238 * auVar105._8_4_;
      fVar239 = auVar96._12_4_;
      auVar57._12_4_ = fVar239 * auVar105._12_4_;
      fVar215 = auVar96._16_4_;
      auVar57._16_4_ = fVar215 * auVar105._16_4_;
      fVar216 = auVar96._20_4_;
      auVar57._20_4_ = fVar216 * auVar105._20_4_;
      fVar217 = auVar96._24_4_;
      auVar57._24_4_ = fVar217 * auVar105._24_4_;
      auVar57._28_4_ = auVar105._28_4_;
      auVar98 = vminps_avx512vl(auVar98,auVar122);
      auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar98 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
      auVar93 = vminps_avx512vl(auVar57,auVar122);
      auVar58._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar98._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar58,local_700,local_6a0);
      auVar98 = vmaxps_avx(auVar93,ZEXT832(0) << 0x20);
      auVar59._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
      auVar59._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
      auVar59._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
      auVar59._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
      auVar59._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
      auVar59._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
      auVar59._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
      auVar59._28_4_ = auVar98._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar59,local_700,local_6a0);
      auVar60._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar60._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar60._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar60._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar60._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar60._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar60._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar60._28_4_ = auVar95._28_4_;
      auVar98 = vsubps_avx(local_620,auVar60);
      auVar61._4_4_ = auVar98._4_4_ * (float)local_580._4_4_;
      auVar61._0_4_ = auVar98._0_4_ * (float)local_580._0_4_;
      auVar61._8_4_ = auVar98._8_4_ * fStack_578;
      auVar61._12_4_ = auVar98._12_4_ * fStack_574;
      auVar61._16_4_ = auVar98._16_4_ * fStack_570;
      auVar61._20_4_ = auVar98._20_4_ * fStack_56c;
      auVar61._24_4_ = auVar98._24_4_ * fStack_568;
      auVar61._28_4_ = auVar95._28_4_;
      auVar105 = vsubps_avx(local_560,auVar61);
      uVar15 = vcmpps_avx512vl(auVar105,ZEXT832(0) << 0x20,5);
      bVar76 = (byte)uVar15;
      auVar259 = ZEXT3264(local_720);
      auVar260 = ZEXT3264(local_740);
      if (bVar76 == 0) {
        bVar76 = 0;
        auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar225 = ZEXT864(0) << 0x20;
        auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar240 = ZEXT864(0) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar84 = vxorps_avx512vl(auVar144,auVar144);
        uVar77 = vcmpps_avx512vl(auVar105,auVar111,5);
        auVar105 = vsqrtps_avx(auVar105);
        auVar106 = vfnmadd213ps_avx512vl(auVar119,local_480,auVar122);
        auVar95 = vfmadd132ps_avx512vl(auVar106,local_480,local_480);
        auVar106 = vsubps_avx(local_6e0,auVar105);
        auVar94 = vmulps_avx512vl(auVar106,auVar95);
        auVar105 = vsubps_avx512vl(auVar105,auVar115);
        auVar107 = vmulps_avx512vl(auVar105,auVar95);
        auVar105 = vfmadd213ps_avx512vl(auVar117,auVar94,auVar99);
        auVar62._4_4_ = fVar141 * auVar105._4_4_;
        auVar62._0_4_ = fVar233 * auVar105._0_4_;
        auVar62._8_4_ = fVar238 * auVar105._8_4_;
        auVar62._12_4_ = fVar239 * auVar105._12_4_;
        auVar62._16_4_ = fVar215 * auVar105._16_4_;
        auVar62._20_4_ = fVar216 * auVar105._20_4_;
        auVar62._24_4_ = fVar217 * auVar105._24_4_;
        auVar62._28_4_ = auVar93._28_4_;
        auVar105 = vmulps_avx512vl(local_3c0,auVar94);
        auVar106 = vmulps_avx512vl(local_3e0,auVar94);
        auVar69._4_4_ = uStack_45c;
        auVar69._0_4_ = local_460;
        auVar69._8_4_ = uStack_458;
        auVar69._12_4_ = uStack_454;
        auVar69._16_4_ = uStack_450;
        auVar69._20_4_ = uStack_44c;
        auVar69._24_4_ = uStack_448;
        auVar69._28_4_ = uStack_444;
        auVar93 = vmulps_avx512vl(auVar69,auVar94);
        auVar95 = vfmadd213ps_avx512vl(auVar100,auVar62,auVar102);
        auVar105 = vsubps_avx512vl(auVar105,auVar95);
        auVar95 = vfmadd213ps_avx512vl(auVar101,auVar62,auVar103);
        auVar95 = vsubps_avx512vl(auVar106,auVar95);
        auVar83 = vfmadd213ps_fma(auVar62,auVar97,auVar104);
        auVar106 = vsubps_avx(auVar93,ZEXT1632(auVar83));
        auVar240 = ZEXT3264(auVar106);
        auVar99 = vfmadd213ps_avx512vl(auVar117,auVar107,auVar99);
        auVar63._4_4_ = fVar141 * auVar99._4_4_;
        auVar63._0_4_ = fVar233 * auVar99._0_4_;
        auVar63._8_4_ = fVar238 * auVar99._8_4_;
        auVar63._12_4_ = fVar239 * auVar99._12_4_;
        auVar63._16_4_ = fVar215 * auVar99._16_4_;
        auVar63._20_4_ = fVar216 * auVar99._20_4_;
        auVar63._24_4_ = fVar217 * auVar99._24_4_;
        auVar63._28_4_ = auVar96._28_4_;
        auVar96 = vmulps_avx512vl(local_3c0,auVar107);
        auVar99 = vmulps_avx512vl(local_3e0,auVar107);
        auVar93 = vmulps_avx512vl(auVar69,auVar107);
        auVar83 = vfmadd213ps_fma(auVar100,auVar63,auVar102);
        auVar106 = vsubps_avx(auVar96,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar101,auVar63,auVar103);
        auVar96 = vsubps_avx(auVar99,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar97,auVar63,auVar104);
        auVar99 = vsubps_avx512vl(auVar93,ZEXT1632(auVar83));
        auVar225 = ZEXT3264(auVar99);
        auVar152._8_4_ = 0x7f800000;
        auVar152._0_8_ = 0x7f8000007f800000;
        auVar152._12_4_ = 0x7f800000;
        auVar152._16_4_ = 0x7f800000;
        auVar152._20_4_ = 0x7f800000;
        auVar152._24_4_ = 0x7f800000;
        auVar152._28_4_ = 0x7f800000;
        auVar99 = vblendmps_avx512vl(auVar152,auVar94);
        bVar79 = (bool)((byte)uVar77 & 1);
        auVar129._0_4_ = (uint)bVar79 * auVar99._0_4_ | (uint)!bVar79 * auVar102._0_4_;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar79 * auVar99._4_4_ | (uint)!bVar79 * auVar102._4_4_;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar79 * auVar99._8_4_ | (uint)!bVar79 * auVar102._8_4_;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar79 * auVar99._12_4_ | (uint)!bVar79 * auVar102._12_4_;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar79 * auVar99._16_4_ | (uint)!bVar79 * auVar102._16_4_;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar79 * auVar99._20_4_ | (uint)!bVar79 * auVar102._20_4_;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar79 * auVar99._24_4_ | (uint)!bVar79 * auVar102._24_4_;
        bVar79 = SUB81(uVar77 >> 7,0);
        auVar129._28_4_ = (uint)bVar79 * auVar99._28_4_ | (uint)!bVar79 * auVar102._28_4_;
        auVar153._8_4_ = 0xff800000;
        auVar153._0_8_ = 0xff800000ff800000;
        auVar153._12_4_ = 0xff800000;
        auVar153._16_4_ = 0xff800000;
        auVar153._20_4_ = 0xff800000;
        auVar153._24_4_ = 0xff800000;
        auVar153._28_4_ = 0xff800000;
        auVar99 = vblendmps_avx512vl(auVar153,auVar107);
        bVar79 = (bool)((byte)uVar77 & 1);
        auVar130._0_4_ = (uint)bVar79 * auVar99._0_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar79 * auVar99._4_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar79 * auVar99._8_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar79 * auVar99._12_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar79 * auVar99._16_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar79 * auVar99._20_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar79 * auVar99._24_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = SUB81(uVar77 >> 7,0);
        auVar130._28_4_ = (uint)bVar79 * auVar99._28_4_ | (uint)!bVar79 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar99 = vmulps_avx512vl(_local_4a0,auVar31);
        uVar16 = vcmpps_avx512vl(auVar99,local_4c0,0xe);
        uVar77 = uVar77 & uVar16;
        bVar74 = (byte)uVar77;
        if (bVar74 != 0) {
          uVar16 = vcmpps_avx512vl(auVar98,ZEXT1632(auVar84),2);
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar245._8_4_ = 0xff800000;
          auVar245._0_8_ = 0xff800000ff800000;
          auVar245._12_4_ = 0xff800000;
          auVar245._16_4_ = 0xff800000;
          auVar245._20_4_ = 0xff800000;
          auVar245._24_4_ = 0xff800000;
          auVar245._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar230,auVar245);
          bVar73 = (byte)uVar16;
          uVar80 = (uint)(bVar73 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar99._0_4_;
          bVar79 = (bool)((byte)(uVar16 >> 1) & 1);
          uVar134 = (uint)bVar79 * auVar98._4_4_ | (uint)!bVar79 * auVar99._4_4_;
          bVar79 = (bool)((byte)(uVar16 >> 2) & 1);
          uVar135 = (uint)bVar79 * auVar98._8_4_ | (uint)!bVar79 * auVar99._8_4_;
          bVar79 = (bool)((byte)(uVar16 >> 3) & 1);
          uVar136 = (uint)bVar79 * auVar98._12_4_ | (uint)!bVar79 * auVar99._12_4_;
          bVar79 = (bool)((byte)(uVar16 >> 4) & 1);
          uVar137 = (uint)bVar79 * auVar98._16_4_ | (uint)!bVar79 * auVar99._16_4_;
          bVar79 = (bool)((byte)(uVar16 >> 5) & 1);
          uVar138 = (uint)bVar79 * auVar98._20_4_ | (uint)!bVar79 * auVar99._20_4_;
          bVar79 = (bool)((byte)(uVar16 >> 6) & 1);
          uVar139 = (uint)bVar79 * auVar98._24_4_ | (uint)!bVar79 * auVar99._24_4_;
          bVar79 = SUB81(uVar16 >> 7,0);
          uVar140 = (uint)bVar79 * auVar98._28_4_ | (uint)!bVar79 * auVar99._28_4_;
          auVar129._0_4_ = (bVar74 & 1) * uVar80 | !(bool)(bVar74 & 1) * auVar129._0_4_;
          bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar129._4_4_ = bVar79 * uVar134 | !bVar79 * auVar129._4_4_;
          bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar129._8_4_ = bVar79 * uVar135 | !bVar79 * auVar129._8_4_;
          bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar129._12_4_ = bVar79 * uVar136 | !bVar79 * auVar129._12_4_;
          bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar129._16_4_ = bVar79 * uVar137 | !bVar79 * auVar129._16_4_;
          bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar129._20_4_ = bVar79 * uVar138 | !bVar79 * auVar129._20_4_;
          bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar129._24_4_ = bVar79 * uVar139 | !bVar79 * auVar129._24_4_;
          bVar79 = SUB81(uVar77 >> 7,0);
          auVar129._28_4_ = bVar79 * uVar140 | !bVar79 * auVar129._28_4_;
          auVar98 = vblendmps_avx512vl(auVar245,auVar230);
          bVar79 = (bool)((byte)(uVar16 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar16 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar16 >> 6) & 1);
          bVar11 = SUB81(uVar16 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar74 & 1) *
               ((uint)(bVar73 & 1) * auVar98._0_4_ | !(bool)(bVar73 & 1) * uVar80) |
               !(bool)(bVar74 & 1) * auVar130._0_4_;
          bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar5 * ((uint)bVar79 * auVar98._4_4_ | !bVar79 * uVar134) |
               !bVar5 * auVar130._4_4_;
          bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar79 * ((uint)bVar6 * auVar98._8_4_ | !bVar6 * uVar135) |
               !bVar79 * auVar130._8_4_;
          bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar79 * ((uint)bVar7 * auVar98._12_4_ | !bVar7 * uVar136) |
               !bVar79 * auVar130._12_4_;
          bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar79 * ((uint)bVar8 * auVar98._16_4_ | !bVar8 * uVar137) |
               !bVar79 * auVar130._16_4_;
          bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar79 * ((uint)bVar9 * auVar98._20_4_ | !bVar9 * uVar138) |
               !bVar79 * auVar130._20_4_;
          bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar79 * ((uint)bVar10 * auVar98._24_4_ | !bVar10 * uVar139) |
               !bVar79 * auVar130._24_4_;
          bVar79 = SUB81(uVar77 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar79 * ((uint)bVar11 * auVar98._28_4_ | !bVar11 * uVar140) |
               !bVar79 * auVar130._28_4_;
          bVar76 = (~bVar74 | bVar73) & bVar76;
        }
      }
      auVar257 = ZEXT3264(local_7c0);
      auVar250 = ZEXT3264(local_7e0);
      auVar251 = ZEXT3264(local_800);
      auVar252 = ZEXT3264(local_820);
      auVar253 = ZEXT3264(local_840);
      auVar254 = ZEXT3264(local_860);
      auVar255 = ZEXT3264(local_880);
      auVar256 = ZEXT3264(local_8a0);
      auVar258 = ZEXT3264(local_8c0);
      auVar262 = ZEXT3264(local_8e0);
      uVar143 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar227._4_4_ = uVar143;
      auVar227._0_4_ = uVar143;
      auVar227._8_4_ = uVar143;
      auVar227._12_4_ = uVar143;
      auVar227._16_4_ = uVar143;
      auVar227._20_4_ = uVar143;
      auVar227._24_4_ = uVar143;
      auVar227._28_4_ = uVar143;
      uVar143 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar231._4_4_ = uVar143;
      auVar231._0_4_ = uVar143;
      auVar231._8_4_ = uVar143;
      auVar231._12_4_ = uVar143;
      auVar231._16_4_ = uVar143;
      auVar231._20_4_ = uVar143;
      auVar231._24_4_ = uVar143;
      auVar231._28_4_ = uVar143;
      auVar232 = ZEXT3264(auVar231);
      fVar233 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar246 = ZEXT3264(CONCAT428(fVar233,CONCAT424(fVar233,CONCAT420(fVar233,CONCAT416(fVar233,
                                                  CONCAT412(fVar233,CONCAT48(fVar233,CONCAT44(
                                                  fVar233,fVar233))))))));
      auVar249._0_4_ = fVar233 * auVar225._0_4_;
      auVar249._4_4_ = fVar233 * auVar225._4_4_;
      auVar249._8_4_ = fVar233 * auVar225._8_4_;
      auVar249._12_4_ = fVar233 * auVar225._12_4_;
      auVar249._16_4_ = fVar233 * auVar225._16_4_;
      auVar249._20_4_ = fVar233 * auVar225._20_4_;
      auVar249._28_36_ = auVar225._28_36_;
      auVar249._24_4_ = fVar233 * auVar225._24_4_;
      auVar83 = vfmadd231ps_fma(auVar249._0_32_,auVar231,auVar96);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar227,auVar106);
      auVar249 = ZEXT3264(local_440);
      _local_340 = local_440;
      local_320 = vminps_avx(local_2e0,auVar129);
      auVar242._8_4_ = 0x7fffffff;
      auVar242._0_8_ = 0x7fffffff7fffffff;
      auVar242._12_4_ = 0x7fffffff;
      auVar242._16_4_ = 0x7fffffff;
      auVar242._20_4_ = 0x7fffffff;
      auVar242._24_4_ = 0x7fffffff;
      auVar242._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar242,ZEXT1632(auVar83));
      _local_300 = vmaxps_avx(local_440,auVar130);
      auVar224._8_4_ = 0x3e99999a;
      auVar224._0_8_ = 0x3e99999a3e99999a;
      auVar224._12_4_ = 0x3e99999a;
      auVar224._16_4_ = 0x3e99999a;
      auVar224._20_4_ = 0x3e99999a;
      auVar224._24_4_ = 0x3e99999a;
      auVar224._28_4_ = 0x3e99999a;
      auVar225 = ZEXT3264(auVar224);
      uVar15 = vcmpps_avx512vl(auVar98,auVar224,1);
      uVar18 = vcmpps_avx512vl(local_440,local_320,2);
      bVar74 = (byte)uVar18 & bVar72;
      uVar17 = vcmpps_avx512vl(_local_300,local_2e0,2);
      if ((bVar72 & ((byte)uVar17 | (byte)uVar18)) == 0) {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar98);
      }
      else {
        _local_400 = _local_300;
        local_748 = (uint)(byte)((byte)uVar15 | ~bVar76);
        auVar64._4_4_ = auVar240._4_4_ * fVar233;
        auVar64._0_4_ = auVar240._0_4_ * fVar233;
        auVar64._8_4_ = auVar240._8_4_ * fVar233;
        auVar64._12_4_ = auVar240._12_4_ * fVar233;
        auVar64._16_4_ = auVar240._16_4_ * fVar233;
        auVar64._20_4_ = auVar240._20_4_ * fVar233;
        auVar64._24_4_ = auVar240._24_4_ * fVar233;
        auVar64._28_4_ = local_300._28_4_;
        auVar83 = vfmadd213ps_fma(auVar95,auVar231,auVar64);
        auVar83 = vfmadd213ps_fma(auVar105,auVar227,ZEXT1632(auVar83));
        auVar98 = vandps_avx(auVar242,ZEXT1632(auVar83));
        uVar15 = vcmpps_avx512vl(auVar98,auVar224,1);
        bVar76 = (byte)uVar15 | ~bVar76;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar156,auVar32);
        local_2c0._0_4_ = (uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
        bVar79 = (bool)(bVar76 >> 1 & 1);
        local_2c0._4_4_ = (uint)bVar79 * auVar98._4_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 2 & 1);
        local_2c0._8_4_ = (uint)bVar79 * auVar98._8_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 3 & 1);
        local_2c0._12_4_ = (uint)bVar79 * auVar98._12_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 4 & 1);
        local_2c0._16_4_ = (uint)bVar79 * auVar98._16_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 5 & 1);
        local_2c0._20_4_ = (uint)bVar79 * auVar98._20_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 6 & 1);
        local_2c0._24_4_ = (uint)bVar79 * auVar98._24_4_ | (uint)!bVar79 * 2;
        local_2c0._28_4_ = (uint)(bVar76 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
        local_360 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_360,local_2c0,5);
        local_744 = (uint)bVar74;
        local_3a0 = local_440._0_4_ + (float)local_420._0_4_;
        fStack_39c = local_440._4_4_ + (float)local_420._4_4_;
        fStack_398 = local_440._8_4_ + fStack_418;
        fStack_394 = local_440._12_4_ + fStack_414;
        fStack_390 = local_440._16_4_ + fStack_410;
        fStack_38c = local_440._20_4_ + fStack_40c;
        fStack_388 = local_440._24_4_ + fStack_408;
        fStack_384 = local_440._28_4_ + fStack_404;
        _local_580 = auVar118;
        for (bVar74 = (byte)uVar15 & bVar74; auVar98 = local_900, bVar74 != 0;
            bVar74 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar74 & (byte)uVar15) {
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar157,local_440);
          auVar132._0_4_ =
               (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 1 & 1);
          auVar132._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 2 & 1);
          auVar132._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 3 & 1);
          auVar132._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 4 & 1);
          auVar132._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 5 & 1);
          auVar132._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 6 & 1);
          auVar132._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * 0x7f800000;
          auVar132._28_4_ =
               (uint)(bVar74 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
          auVar96 = vshufps_avx(auVar132,auVar132,0xb1);
          auVar96 = vminps_avx(auVar132,auVar96);
          auVar99 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar99);
          auVar99 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar99);
          uVar15 = vcmpps_avx512vl(auVar132,auVar96,0);
          bVar73 = (byte)uVar15 & bVar74;
          bVar76 = bVar74;
          if (bVar73 != 0) {
            bVar76 = bVar73;
          }
          iVar19 = 0;
          for (uVar80 = (uint)bVar76; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          auVar232 = ZEXT464(*(uint *)(local_340 + (uint)(iVar19 << 2)));
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_560._0_16_ = (undefined1  [16])aVar1;
          auVar83 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar83._0_4_ < 0.0) {
            local_900[1] = 0;
            local_900[0] = bVar74;
            local_900._2_30_ = auVar98._2_30_;
            local_6a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
            local_700._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar19 << 2)));
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            auVar249 = ZEXT1664(auVar249._0_16_);
            fVar233 = sqrtf(auVar83._0_4_);
            auVar232 = ZEXT1664(local_700._0_16_);
            bVar74 = local_900[0];
            auVar262 = ZEXT3264(local_8e0);
            auVar260 = ZEXT3264(local_740);
            auVar259 = ZEXT3264(local_720);
            auVar258 = ZEXT3264(local_8c0);
            auVar256 = ZEXT3264(local_8a0);
            auVar255 = ZEXT3264(local_880);
            auVar254 = ZEXT3264(local_860);
            auVar253 = ZEXT3264(local_840);
            auVar252 = ZEXT3264(local_820);
            auVar251 = ZEXT3264(local_800);
            auVar250 = ZEXT3264(local_7e0);
            auVar257 = ZEXT3264(local_7c0);
            auVar83 = local_6a0._0_16_;
          }
          else {
            auVar83 = vsqrtss_avx(auVar83,auVar83);
            fVar233 = auVar83._0_4_;
            auVar83 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
          }
          auVar89 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar225 = ZEXT3264(_local_600);
          auVar88 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar81 = vminps_avx(auVar89,auVar88);
          auVar89 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar88 = vmaxps_avx(auVar84,auVar89);
          auVar200._8_4_ = 0x7fffffff;
          auVar200._0_8_ = 0x7fffffff7fffffff;
          auVar200._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx(auVar81,auVar200);
          auVar89 = vandps_avx(auVar88,auVar200);
          auVar84 = vmaxps_avx(auVar84,auVar89);
          auVar89 = vmovshdup_avx(auVar84);
          auVar89 = vmaxss_avx(auVar89,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar89);
          fVar141 = auVar84._0_4_ * 1.9073486e-06;
          local_680._0_4_ = fVar233 * 1.9073486e-06;
          local_520 = vshufps_avx(auVar88,auVar88,0xff);
          auVar83 = vinsertps_avx(auVar232._0_16_,auVar83,0x10);
          auVar240 = ZEXT1664(auVar83);
          lVar78 = 5;
          do {
            do {
              bVar79 = lVar78 == 0;
              lVar78 = lVar78 + -1;
              if (bVar79) goto LAB_01a94b65;
              uVar143 = auVar240._0_4_;
              auVar146._4_4_ = uVar143;
              auVar146._0_4_ = uVar143;
              auVar146._8_4_ = uVar143;
              auVar146._12_4_ = uVar143;
              auVar83 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_560._0_16_);
              _local_580 = auVar240._0_16_;
              auVar84 = vmovshdup_avx(auVar240._0_16_);
              fVar215 = auVar84._0_4_;
              fVar164 = 1.0 - fVar215;
              fVar239 = fVar164 * fVar164 * fVar164;
              fVar233 = fVar215 * fVar215;
              fVar217 = fVar215 * fVar233;
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                        ZEXT416((uint)fVar217));
              fVar238 = fVar215 * fVar164;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar238 * 6.0)),
                                        ZEXT416((uint)(fVar164 * fVar238)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                        ZEXT416((uint)fVar239));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * fVar238 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar215 * fVar238)));
              fVar239 = fVar239 * 0.16666667;
              fVar215 = (auVar89._0_4_ + auVar81._0_4_) * 0.16666667;
              fVar216 = (auVar88._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar217 = fVar217 * 0.16666667;
              auVar181._0_4_ = fVar217 * (float)local_600._0_4_;
              auVar181._4_4_ = fVar217 * (float)local_600._4_4_;
              auVar181._8_4_ = fVar217 * fStack_5f8;
              auVar181._12_4_ = fVar217 * fStack_5f4;
              auVar218._4_4_ = fVar216;
              auVar218._0_4_ = fVar216;
              auVar218._8_4_ = fVar216;
              auVar218._12_4_ = fVar216;
              auVar89 = vfmadd132ps_fma(auVar218,auVar181,local_5c0._0_16_);
              auVar182._4_4_ = fVar215;
              auVar182._0_4_ = fVar215;
              auVar182._8_4_ = fVar215;
              auVar182._12_4_ = fVar215;
              auVar89 = vfmadd132ps_fma(auVar182,auVar89,local_5e0._0_16_);
              auVar166._4_4_ = fVar239;
              auVar166._0_4_ = fVar239;
              auVar166._8_4_ = fVar239;
              auVar166._12_4_ = fVar239;
              auVar89 = vfmadd132ps_fma(auVar166,auVar89,local_5a0._0_16_);
              local_480._0_16_ = auVar89;
              auVar89 = vsubps_avx(auVar83,auVar89);
              auVar83 = vdpps_avx(auVar89,auVar89,0x7f);
              local_700._0_16_ = auVar89;
              local_620._0_16_ = auVar83;
              local_900._0_16_ = auVar84;
              local_6a0._0_16_ = ZEXT416((uint)fVar164);
              if (auVar83._0_4_ < 0.0) {
                local_6c0._0_4_ = fVar233;
                local_6e0._0_4_ = fVar238;
                auVar246._0_4_ = sqrtf(auVar83._0_4_);
                auVar246._4_60_ = extraout_var;
                auVar83 = auVar246._0_16_;
                fVar238 = (float)local_6e0._0_4_;
                auVar84 = local_900._0_16_;
                auVar89 = local_6a0._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                local_6c0._0_4_ = fVar233;
                auVar89 = ZEXT416((uint)fVar164);
              }
              local_4a0._4_4_ = auVar89._0_4_;
              local_4a0._0_4_ = local_4a0._4_4_;
              fStack_498 = (float)local_4a0._4_4_;
              fStack_494 = (float)local_4a0._4_4_;
              auVar88 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar238 * 4.0)));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * 4.0)),auVar89,auVar89);
              fVar233 = (float)local_4a0._4_4_ * -(float)local_4a0._4_4_ * 0.5;
              fVar238 = auVar88._0_4_ * 0.5;
              fVar239 = auVar84._0_4_ * 0.5;
              local_6c0._0_4_ = (float)local_6c0._0_4_ * 0.5;
              auVar201._0_4_ = (float)local_6c0._0_4_ * (float)local_600._0_4_;
              auVar201._4_4_ = (float)local_6c0._0_4_ * (float)local_600._4_4_;
              auVar201._8_4_ = (float)local_6c0._0_4_ * fStack_5f8;
              auVar201._12_4_ = (float)local_6c0._0_4_ * fStack_5f4;
              auVar167._4_4_ = fVar239;
              auVar167._0_4_ = fVar239;
              auVar167._8_4_ = fVar239;
              auVar167._12_4_ = fVar239;
              auVar84 = vfmadd132ps_fma(auVar167,auVar201,local_5c0._0_16_);
              auVar183._4_4_ = fVar238;
              auVar183._0_4_ = fVar238;
              auVar183._8_4_ = fVar238;
              auVar183._12_4_ = fVar238;
              auVar84 = vfmadd132ps_fma(auVar183,auVar84,local_5e0._0_16_);
              auVar247._4_4_ = fVar233;
              auVar247._0_4_ = fVar233;
              auVar247._8_4_ = fVar233;
              auVar247._12_4_ = fVar233;
              local_6c0._0_16_ = vfmadd132ps_fma(auVar247,auVar84,local_5a0._0_16_);
              local_4c0._0_16_ = vdpps_avx(local_6c0._0_16_,local_6c0._0_16_,0x7f);
              auVar65._12_4_ = 0;
              auVar65._0_12_ = ZEXT812(0);
              fVar238 = local_4c0._0_4_;
              local_670 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar238));
              fVar233 = local_670._0_4_ * 1.5;
              local_4d0 = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar238));
              auVar84 = vfnmadd213ss_fma(local_4d0,local_4c0._0_16_,ZEXT416(0x40000000));
              local_6e0._0_4_ = auVar83._0_4_;
              if (fVar238 < -fVar238) {
                local_790._0_4_ = fVar233;
                local_7a0._0_4_ = fVar238 * -0.5;
                fVar239 = sqrtf(fVar238);
                auVar83 = ZEXT416((uint)local_6e0._0_4_);
                fVar233 = (float)local_790._0_4_;
                fVar238 = (float)local_7a0._0_4_;
                auVar89 = local_6c0._0_16_;
              }
              else {
                auVar89 = vsqrtss_avx(local_4c0._0_16_,local_4c0._0_16_);
                fVar239 = auVar89._0_4_;
                fVar238 = fVar238 * -0.5;
                auVar89 = local_6c0._0_16_;
              }
              fVar215 = local_670._0_4_;
              fVar233 = fVar233 + fVar238 * fVar215 * fVar215 * fVar215;
              local_670._0_4_ = auVar89._0_4_ * fVar233;
              local_670._4_4_ = auVar89._4_4_ * fVar233;
              local_670._8_4_ = auVar89._8_4_ * fVar233;
              local_670._12_4_ = auVar89._12_4_ * fVar233;
              auVar88 = vdpps_avx(local_700._0_16_,local_670,0x7f);
              fVar238 = auVar83._0_4_ + 1.0;
              auVar147._0_4_ = auVar88._0_4_ * auVar88._0_4_;
              auVar147._4_4_ = auVar88._4_4_ * auVar88._4_4_;
              auVar147._8_4_ = auVar88._8_4_ * auVar88._8_4_;
              auVar147._12_4_ = auVar88._12_4_ * auVar88._12_4_;
              auVar81 = vsubps_avx(local_620._0_16_,auVar147);
              fVar215 = auVar81._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar215;
              auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              auVar82 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
              auVar86 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
              if (fVar215 < 0.0) {
                local_790._0_4_ = fVar238;
                local_4e0._0_4_ = fVar239;
                local_500._0_4_ = auVar82._0_4_;
                local_510._4_4_ = fVar233;
                local_510._0_4_ = fVar233;
                fStack_508 = fVar233;
                fStack_504 = fVar233;
                local_7a0 = auVar88;
                local_4f0 = auVar85;
                fVar215 = sqrtf(fVar215);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar82 = ZEXT416((uint)local_500._0_4_);
                auVar83 = ZEXT416((uint)local_6e0._0_4_);
                auVar85 = local_4f0;
                auVar89 = local_6c0._0_16_;
                fVar238 = (float)local_790._0_4_;
                auVar88 = local_7a0;
                fVar233 = (float)local_510._0_4_;
                fVar216 = (float)local_510._4_4_;
                fVar217 = fStack_508;
                fVar164 = fStack_504;
                fVar239 = (float)local_4e0._0_4_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar215 = auVar81._0_4_;
                fVar216 = fVar233;
                fVar217 = fVar233;
                fVar164 = fVar233;
              }
              auVar249 = ZEXT1664(auVar89);
              auVar246 = ZEXT1664(local_620._0_16_);
              auVar257 = ZEXT3264(local_7c0);
              auVar250 = ZEXT3264(local_7e0);
              auVar251 = ZEXT3264(local_800);
              auVar252 = ZEXT3264(local_820);
              auVar253 = ZEXT3264(local_840);
              auVar254 = ZEXT3264(local_860);
              auVar255 = ZEXT3264(local_880);
              auVar256 = ZEXT3264(local_8a0);
              auVar258 = ZEXT3264(local_8c0);
              auVar259 = ZEXT3264(local_720);
              auVar260 = ZEXT3264(local_740);
              auVar262 = ZEXT3264(local_8e0);
              auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6a0._0_16_,
                                        local_900._0_16_);
              auVar91 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_6a0._0_16_);
              auVar81 = vshufps_avx(_local_580,_local_580,0x55);
              auVar184._0_4_ = auVar81._0_4_ * (float)local_600._0_4_;
              auVar184._4_4_ = auVar81._4_4_ * (float)local_600._4_4_;
              auVar184._8_4_ = auVar81._8_4_ * fStack_5f8;
              auVar184._12_4_ = auVar81._12_4_ * fStack_5f4;
              auVar202._0_4_ = auVar91._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar81 = vfmadd132ps_fma(auVar202,auVar184,local_5c0._0_16_);
              auVar169._0_4_ = auVar90._0_4_;
              auVar169._4_4_ = auVar169._0_4_;
              auVar169._8_4_ = auVar169._0_4_;
              auVar169._12_4_ = auVar169._0_4_;
              auVar81 = vfmadd132ps_fma(auVar169,auVar81,local_5e0._0_16_);
              auVar81 = vfmadd132ps_fma(_local_4a0,auVar81,local_5a0._0_16_);
              auVar170._0_4_ = auVar81._0_4_ * (float)local_4c0._0_4_;
              auVar170._4_4_ = auVar81._4_4_ * (float)local_4c0._0_4_;
              auVar170._8_4_ = auVar81._8_4_ * (float)local_4c0._0_4_;
              auVar170._12_4_ = auVar81._12_4_ * (float)local_4c0._0_4_;
              auVar81 = vdpps_avx(auVar89,auVar81,0x7f);
              fVar179 = auVar81._0_4_;
              auVar185._0_4_ = auVar89._0_4_ * fVar179;
              auVar185._4_4_ = auVar89._4_4_ * fVar179;
              auVar185._8_4_ = auVar89._8_4_ * fVar179;
              auVar185._12_4_ = auVar89._12_4_ * fVar179;
              auVar81 = vsubps_avx(auVar170,auVar185);
              fVar179 = auVar84._0_4_ * (float)local_4d0._0_4_;
              auVar90 = vmaxss_avx(ZEXT416((uint)fVar141),
                                   ZEXT416((uint)(local_580._0_4_ * (float)local_680._0_4_)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(auVar89,auVar20);
              auVar186._0_4_ = fVar233 * auVar81._0_4_ * fVar179;
              auVar186._4_4_ = fVar216 * auVar81._4_4_ * fVar179;
              auVar186._8_4_ = fVar217 * auVar81._8_4_ * fVar179;
              auVar186._12_4_ = fVar164 * auVar81._12_4_ * fVar179;
              auVar84 = vdpps_avx(auVar87,local_670,0x7f);
              auVar81 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar141),auVar90);
              auVar83 = vdpps_avx(local_700._0_16_,auVar186,0x7f);
              auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar238),ZEXT416((uint)(fVar141 / fVar239)),
                                        auVar81);
              fVar233 = auVar84._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_560._0_16_,local_670,0x7f);
              auVar84 = vdpps_avx(local_700._0_16_,auVar87,0x7f);
              auVar81 = vmulss_avx512f(auVar86,auVar85);
              auVar86 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar81._0_4_ *
                                                             auVar85._0_4_ * auVar85._0_4_)));
              auVar81 = vdpps_avx(local_700._0_16_,local_560._0_16_,0x7f);
              auVar82 = vfnmadd231ss_fma(auVar84,auVar88,ZEXT416((uint)fVar233));
              auVar81 = vfnmadd231ss_fma(auVar81,auVar88,auVar83);
              auVar84 = vpermilps_avx(local_480._0_16_,0xff);
              fVar215 = fVar215 - auVar84._0_4_;
              auVar85 = vshufps_avx(auVar89,auVar89,0xff);
              auVar84 = vfmsub213ss_fma(auVar82,auVar86,auVar85);
              auVar235._8_4_ = 0x80000000;
              auVar235._0_8_ = 0x8000000080000000;
              auVar235._12_4_ = 0x80000000;
              auVar237 = ZEXT1664(auVar235);
              auVar228._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar228._8_4_ = auVar84._8_4_ ^ 0x80000000;
              auVar228._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar232 = ZEXT1664(auVar228);
              auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar86._0_4_));
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar233),auVar81);
              auVar84 = vinsertps_avx(auVar228,auVar81,0x1c);
              auVar222._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar233),auVar222,0x10);
              auVar203._0_4_ = auVar82._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar83 = vdivps_avx(auVar84,auVar203);
              auVar84 = vdivps_avx(auVar81,auVar203);
              fVar233 = auVar88._0_4_;
              auVar225 = ZEXT1664(CONCAT412(fVar215,CONCAT48(fVar215,CONCAT44(fVar215,fVar215))));
              auVar204._0_4_ = fVar233 * auVar83._0_4_ + fVar215 * auVar84._0_4_;
              auVar204._4_4_ = fVar233 * auVar83._4_4_ + fVar215 * auVar84._4_4_;
              auVar204._8_4_ = fVar233 * auVar83._8_4_ + fVar215 * auVar84._8_4_;
              auVar204._12_4_ = fVar233 * auVar83._12_4_ + fVar215 * auVar84._12_4_;
              auVar83 = vsubps_avx(_local_580,auVar204);
              auVar240 = ZEXT1664(auVar83);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(auVar88,auVar21);
            } while (auVar91._0_4_ <= auVar84._0_4_);
            auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar90._0_4_)),local_520,
                                      ZEXT416(0x36000000));
            auVar22._8_4_ = 0x7fffffff;
            auVar22._0_8_ = 0x7fffffff7fffffff;
            auVar22._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx512vl(ZEXT416((uint)fVar215),auVar22);
          } while (auVar84._0_4_ <= auVar88._0_4_);
          fVar233 = auVar83._0_4_ + (float)local_530._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar233) &&
             (fVar141 = (ray->super_RayK<1>).tfar, fVar233 <= fVar141)) {
            auVar84 = vmovshdup_avx(auVar83);
            fVar238 = auVar84._0_4_;
            if ((0.0 <= fVar238) && (fVar238 <= 1.0)) {
              auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_620._0_4_));
              fVar215 = auVar84._0_4_;
              fVar239 = local_620._0_4_ * -0.5;
              auVar225 = ZEXT464((uint)fVar239);
              pGVar3 = (context->scene->geometries).items[local_910].ptr;
              if ((pGVar3->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar239 = fVar215 * 1.5 + fVar239 * fVar215 * fVar215 * fVar215;
                auVar205._0_4_ = local_700._0_4_ * fVar239;
                auVar205._4_4_ = local_700._4_4_ * fVar239;
                auVar205._8_4_ = local_700._8_4_ * fVar239;
                auVar205._12_4_ = local_700._12_4_ * fVar239;
                auVar85 = vfmadd213ps_fma(auVar85,auVar205,auVar89);
                auVar84 = vshufps_avx(auVar205,auVar205,0xc9);
                auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                auVar206._0_4_ = auVar205._0_4_ * auVar88._0_4_;
                auVar206._4_4_ = auVar205._4_4_ * auVar88._4_4_;
                auVar206._8_4_ = auVar205._8_4_ * auVar88._8_4_;
                auVar206._12_4_ = auVar205._12_4_ * auVar88._12_4_;
                auVar81 = vfmsub231ps_fma(auVar206,auVar89,auVar84);
                auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar88 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar225 = ZEXT1664(auVar88);
                auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                auVar148._0_4_ = auVar85._0_4_ * auVar81._0_4_;
                auVar148._4_4_ = auVar85._4_4_ * auVar81._4_4_;
                auVar148._8_4_ = auVar85._8_4_ * auVar81._8_4_;
                auVar148._12_4_ = auVar85._12_4_ * auVar81._12_4_;
                auVar81 = vfmsub231ps_fma(auVar148,auVar84,auVar88);
                auVar84 = vshufps_avx(auVar81,auVar81,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar233;
                  uVar15 = vmovlps_avx(auVar84);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar15;
                  (ray->Ng).field_0.field_0.z = auVar81._0_4_;
                  ray->u = fVar238;
                  ray->v = 0.0;
                  ray->primID = (uint)local_908;
                  ray->geomID = (uint)local_910;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_900._0_4_ = fVar141;
                  local_660 = vmovlps_avx(auVar84);
                  local_658 = auVar81._0_4_;
                  local_654 = fVar238;
                  local_650 = 0;
                  local_64c = (uint)local_908;
                  local_648 = (uint)local_910;
                  local_644 = context->user->instID[0];
                  local_640 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar233;
                  local_914 = -1;
                  local_780.valid = &local_914;
                  local_780.geometryUserPtr = pGVar3->userPtr;
                  local_780.context = context->user;
                  local_780.ray = (RTCRayN *)ray;
                  local_780.hit = (RTCHitN *)&local_660;
                  local_780.N = 1;
                  if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a94cc4:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar225 = ZEXT1664(auVar225._0_16_);
                      auVar232 = ZEXT1664(auVar232._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      (*p_Var4)(&local_780);
                      auVar262 = ZEXT3264(local_8e0);
                      auVar260 = ZEXT3264(local_740);
                      auVar259 = ZEXT3264(local_720);
                      auVar258 = ZEXT3264(local_8c0);
                      auVar256 = ZEXT3264(local_8a0);
                      auVar255 = ZEXT3264(local_880);
                      auVar254 = ZEXT3264(local_860);
                      auVar253 = ZEXT3264(local_840);
                      auVar252 = ZEXT3264(local_820);
                      auVar251 = ZEXT3264(local_800);
                      auVar250 = ZEXT3264(local_7e0);
                      auVar257 = ZEXT3264(local_7c0);
                      if (*local_780.valid == 0) goto LAB_01a94dbf;
                    }
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).components[0] =
                         *(float *)local_780.hit;
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_780.hit + 4);
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_780.hit + 8);
                    *(float *)((long)local_780.ray + 0x3c) = *(float *)(local_780.hit + 0xc);
                    *(float *)((long)local_780.ray + 0x40) = *(float *)(local_780.hit + 0x10);
                    *(float *)((long)local_780.ray + 0x44) = *(float *)(local_780.hit + 0x14);
                    *(float *)((long)local_780.ray + 0x48) = *(float *)(local_780.hit + 0x18);
                    *(float *)((long)local_780.ray + 0x4c) = *(float *)(local_780.hit + 0x1c);
                    *(float *)((long)local_780.ray + 0x50) = *(float *)(local_780.hit + 0x20);
                  }
                  else {
                    auVar225 = ZEXT1664(auVar88);
                    auVar232 = ZEXT1664(auVar228);
                    auVar237 = ZEXT1664(auVar235);
                    auVar240 = ZEXT1664(auVar83);
                    auVar246 = ZEXT1664(local_620._0_16_);
                    auVar249 = ZEXT1664(auVar89);
                    (*pGVar3->intersectionFilterN)(&local_780);
                    auVar262 = ZEXT3264(local_8e0);
                    auVar260 = ZEXT3264(local_740);
                    auVar259 = ZEXT3264(local_720);
                    auVar258 = ZEXT3264(local_8c0);
                    auVar256 = ZEXT3264(local_8a0);
                    auVar255 = ZEXT3264(local_880);
                    auVar254 = ZEXT3264(local_860);
                    auVar253 = ZEXT3264(local_840);
                    auVar252 = ZEXT3264(local_820);
                    auVar251 = ZEXT3264(local_800);
                    auVar250 = ZEXT3264(local_7e0);
                    auVar257 = ZEXT3264(local_7c0);
                    if (*local_780.valid != 0) goto LAB_01a94cc4;
LAB_01a94dbf:
                    (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                  }
                }
              }
            }
          }
LAB_01a94b65:
          auVar70._4_4_ = fStack_39c;
          auVar70._0_4_ = local_3a0;
          auVar70._8_4_ = fStack_398;
          auVar70._12_4_ = fStack_394;
          auVar70._16_4_ = fStack_390;
          auVar70._20_4_ = fStack_38c;
          auVar70._24_4_ = fStack_388;
          auVar70._28_4_ = fStack_384;
          fVar233 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar233;
          auVar33._0_4_ = fVar233;
          auVar33._8_4_ = fVar233;
          auVar33._12_4_ = fVar233;
          auVar33._16_4_ = fVar233;
          auVar33._20_4_ = fVar233;
          auVar33._24_4_ = fVar233;
          auVar33._28_4_ = fVar233;
          uVar15 = vcmpps_avx512vl(auVar70,auVar33,2);
        }
        auVar177._0_4_ = (float)local_420._0_4_ + (float)local_400._0_4_;
        auVar177._4_4_ = (float)local_420._4_4_ + (float)local_400._4_4_;
        auVar177._8_4_ = fStack_418 + fStack_3f8;
        auVar177._12_4_ = fStack_414 + fStack_3f4;
        auVar177._16_4_ = fStack_410 + fStack_3f0;
        auVar177._20_4_ = fStack_40c + fStack_3ec;
        auVar177._24_4_ = fStack_408 + fStack_3e8;
        auVar177._28_4_ = fStack_404 + fStack_3e4;
        fVar141 = (ray->super_RayK<1>).tfar;
        fVar233 = (ray->super_RayK<1>).tfar;
        auVar34._4_4_ = fVar233;
        auVar34._0_4_ = fVar233;
        auVar34._8_4_ = fVar233;
        auVar34._12_4_ = fVar233;
        auVar34._16_4_ = fVar233;
        auVar34._20_4_ = fVar233;
        auVar34._24_4_ = fVar233;
        auVar34._28_4_ = fVar233;
        uVar15 = vcmpps_avx512vl(auVar177,auVar34,2);
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar178,auVar35);
        bVar79 = (bool)((byte)local_748 & 1);
        local_400._0_4_ = (uint)bVar79 * auVar98._0_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)((byte)(local_748 >> 1) & 1);
        local_400._4_4_ = (uint)bVar79 * auVar98._4_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)((byte)(local_748 >> 2) & 1);
        fStack_3f8 = (float)((uint)bVar79 * auVar98._8_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_748 >> 3) & 1);
        fStack_3f4 = (float)((uint)bVar79 * auVar98._12_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_748 >> 4) & 1);
        fStack_3f0 = (float)((uint)bVar79 * auVar98._16_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_748 >> 5) & 1);
        fStack_3ec = (float)((uint)bVar79 * auVar98._20_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_748 >> 6) & 1);
        fStack_3e8 = (float)((uint)bVar79 * auVar98._24_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_748 >> 7) & 1);
        fStack_3e4 = (float)((uint)bVar79 * auVar98._28_4_ | (uint)!bVar79 * 2);
        bVar72 = (byte)uVar17 & bVar72 & (byte)uVar15;
        uVar15 = vpcmpd_avx512vl(_local_400,local_360,2);
        bVar76 = (byte)uVar15 & bVar72;
        local_440 = _local_300;
        local_3a0 = (float)local_420._0_4_ + (float)local_300._0_4_;
        fStack_39c = (float)local_420._4_4_ + (float)local_300._4_4_;
        fStack_398 = fStack_418 + fStack_2f8;
        fStack_394 = fStack_414 + fStack_2f4;
        fStack_390 = fStack_410 + fStack_2f0;
        fStack_38c = fStack_40c + fStack_2ec;
        fStack_388 = fStack_408 + fStack_2e8;
        fStack_384 = fStack_404 + fStack_2e4;
        while( true ) {
          auVar98 = local_900;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar261 = ZEXT3264(auVar96);
          if (bVar76 == 0) break;
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar158,local_440);
          auVar133._0_4_ =
               (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 6 & 1);
          auVar133._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * 0x7f800000;
          auVar133._28_4_ =
               (uint)(bVar76 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
          auVar96 = vshufps_avx(auVar133,auVar133,0xb1);
          auVar96 = vminps_avx(auVar133,auVar96);
          auVar99 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar99);
          auVar99 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar99);
          uVar15 = vcmpps_avx512vl(auVar133,auVar96,0);
          bVar73 = (byte)uVar15 & bVar76;
          bVar74 = bVar76;
          if (bVar73 != 0) {
            bVar74 = bVar73;
          }
          iVar19 = 0;
          for (uVar80 = (uint)bVar74; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          auVar232 = ZEXT464(*(uint *)(local_2e0 + (uint)(iVar19 << 2)));
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_560._0_16_ = (undefined1  [16])aVar1;
          auVar83 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar83._0_4_ < 0.0) {
            local_900[1] = 0;
            local_900[0] = bVar76;
            local_900._2_30_ = auVar98._2_30_;
            local_6a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
            local_700._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar19 << 2)));
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            auVar249 = ZEXT1664(auVar249._0_16_);
            fVar233 = sqrtf(auVar83._0_4_);
            auVar232 = ZEXT1664(local_700._0_16_);
            bVar76 = local_900[0];
            auVar262 = ZEXT3264(local_8e0);
            auVar260 = ZEXT3264(local_740);
            auVar259 = ZEXT3264(local_720);
            auVar258 = ZEXT3264(local_8c0);
            auVar256 = ZEXT3264(local_8a0);
            auVar255 = ZEXT3264(local_880);
            auVar254 = ZEXT3264(local_860);
            auVar253 = ZEXT3264(local_840);
            auVar252 = ZEXT3264(local_820);
            auVar251 = ZEXT3264(local_800);
            auVar250 = ZEXT3264(local_7e0);
            auVar257 = ZEXT3264(local_7c0);
            auVar83 = local_6a0._0_16_;
          }
          else {
            auVar83 = vsqrtss_avx(auVar83,auVar83);
            fVar233 = auVar83._0_4_;
            auVar83 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
          }
          auVar89 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar84 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar225 = ZEXT3264(_local_600);
          auVar88 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar81 = vminps_avx(auVar89,auVar88);
          auVar89 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar88 = vmaxps_avx(auVar84,auVar89);
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx(auVar81,auVar207);
          auVar89 = vandps_avx(auVar88,auVar207);
          auVar84 = vmaxps_avx(auVar84,auVar89);
          auVar89 = vmovshdup_avx(auVar84);
          auVar89 = vmaxss_avx(auVar89,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar89);
          local_670._0_4_ = auVar84._0_4_ * 1.9073486e-06;
          local_520 = vshufps_avx(auVar88,auVar88,0xff);
          auVar83 = vinsertps_avx(auVar232._0_16_,auVar83,0x10);
          auVar240 = ZEXT1664(auVar83);
          lVar78 = 5;
          do {
            do {
              bVar79 = lVar78 == 0;
              lVar78 = lVar78 + -1;
              if (bVar79) goto LAB_01a95795;
              uVar143 = auVar240._0_4_;
              auVar149._4_4_ = uVar143;
              auVar149._0_4_ = uVar143;
              auVar149._8_4_ = uVar143;
              auVar149._12_4_ = uVar143;
              auVar83 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_560._0_16_);
              _local_580 = auVar240._0_16_;
              auVar84 = vmovshdup_avx(auVar240._0_16_);
              fVar215 = auVar84._0_4_;
              fVar164 = 1.0 - fVar215;
              fVar239 = fVar164 * fVar164 * fVar164;
              fVar141 = fVar215 * fVar215;
              fVar217 = fVar215 * fVar141;
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                        ZEXT416((uint)fVar217));
              fVar238 = fVar215 * fVar164;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar238 * 6.0)),
                                        ZEXT416((uint)(fVar164 * fVar238)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                        ZEXT416((uint)fVar239));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * fVar238 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar215 * fVar238)));
              fVar239 = fVar239 * 0.16666667;
              fVar215 = (auVar89._0_4_ + auVar81._0_4_) * 0.16666667;
              fVar216 = (auVar88._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar217 = fVar217 * 0.16666667;
              auVar187._0_4_ = fVar217 * (float)local_600._0_4_;
              auVar187._4_4_ = fVar217 * (float)local_600._4_4_;
              auVar187._8_4_ = fVar217 * fStack_5f8;
              auVar187._12_4_ = fVar217 * fStack_5f4;
              auVar219._4_4_ = fVar216;
              auVar219._0_4_ = fVar216;
              auVar219._8_4_ = fVar216;
              auVar219._12_4_ = fVar216;
              auVar89 = vfmadd132ps_fma(auVar219,auVar187,local_5c0._0_16_);
              auVar188._4_4_ = fVar215;
              auVar188._0_4_ = fVar215;
              auVar188._8_4_ = fVar215;
              auVar188._12_4_ = fVar215;
              auVar89 = vfmadd132ps_fma(auVar188,auVar89,local_5e0._0_16_);
              auVar171._4_4_ = fVar239;
              auVar171._0_4_ = fVar239;
              auVar171._8_4_ = fVar239;
              auVar171._12_4_ = fVar239;
              auVar89 = vfmadd132ps_fma(auVar171,auVar89,local_5a0._0_16_);
              local_480._0_16_ = auVar89;
              auVar89 = vsubps_avx(auVar83,auVar89);
              auVar83 = vdpps_avx(auVar89,auVar89,0x7f);
              local_700._0_16_ = auVar89;
              local_620._0_16_ = auVar83;
              local_900._0_16_ = auVar84;
              local_6a0._0_16_ = ZEXT416((uint)fVar164);
              if (auVar83._0_4_ < 0.0) {
                local_6c0._0_4_ = fVar141;
                local_6e0._0_4_ = fVar238;
                auVar232._0_4_ = sqrtf(auVar83._0_4_);
                auVar232._4_60_ = extraout_var_00;
                auVar83 = auVar232._0_16_;
                fVar238 = (float)local_6e0._0_4_;
                auVar84 = local_900._0_16_;
                auVar89 = local_6a0._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                local_6c0._0_4_ = fVar141;
                auVar89 = ZEXT416((uint)fVar164);
              }
              local_4a0._4_4_ = auVar89._0_4_;
              local_4a0._0_4_ = local_4a0._4_4_;
              fStack_498 = (float)local_4a0._4_4_;
              fStack_494 = (float)local_4a0._4_4_;
              auVar88 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar238 * 4.0)));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * 4.0)),auVar89,auVar89);
              fVar141 = (float)local_4a0._4_4_ * -(float)local_4a0._4_4_ * 0.5;
              fVar238 = auVar88._0_4_ * 0.5;
              fVar239 = auVar84._0_4_ * 0.5;
              local_6c0._0_4_ = (float)local_6c0._0_4_ * 0.5;
              auVar208._0_4_ = (float)local_6c0._0_4_ * (float)local_600._0_4_;
              auVar208._4_4_ = (float)local_6c0._0_4_ * (float)local_600._4_4_;
              auVar208._8_4_ = (float)local_6c0._0_4_ * fStack_5f8;
              auVar208._12_4_ = (float)local_6c0._0_4_ * fStack_5f4;
              auVar172._4_4_ = fVar239;
              auVar172._0_4_ = fVar239;
              auVar172._8_4_ = fVar239;
              auVar172._12_4_ = fVar239;
              auVar84 = vfmadd132ps_fma(auVar172,auVar208,local_5c0._0_16_);
              auVar189._4_4_ = fVar238;
              auVar189._0_4_ = fVar238;
              auVar189._8_4_ = fVar238;
              auVar189._12_4_ = fVar238;
              auVar84 = vfmadd132ps_fma(auVar189,auVar84,local_5e0._0_16_);
              auVar248._4_4_ = fVar141;
              auVar248._0_4_ = fVar141;
              auVar248._8_4_ = fVar141;
              auVar248._12_4_ = fVar141;
              local_6c0._0_16_ = vfmadd132ps_fma(auVar248,auVar84,local_5a0._0_16_);
              local_4c0._0_16_ = vdpps_avx(local_6c0._0_16_,local_6c0._0_16_,0x7f);
              auVar66._12_4_ = 0;
              auVar66._0_12_ = ZEXT812(0);
              fVar238 = local_4c0._0_4_;
              auVar89 = vrsqrt14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar238));
              fVar141 = auVar89._0_4_ * 1.5;
              local_4d0 = vrcp14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar238));
              auVar84 = vfnmadd213ss_fma(local_4d0,local_4c0._0_16_,ZEXT416(0x40000000));
              local_6e0._0_4_ = auVar83._0_4_;
              if (fVar238 < -fVar238) {
                local_790._0_4_ = fVar141;
                local_7a0._0_4_ = fVar238 * -0.5;
                local_680 = auVar89;
                fVar239 = sqrtf(fVar238);
                auVar83 = ZEXT416((uint)local_6e0._0_4_);
                fVar141 = (float)local_790._0_4_;
                auVar89 = local_680;
                fVar238 = (float)local_7a0._0_4_;
                auVar88 = local_6c0._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(local_4c0._0_16_,local_4c0._0_16_);
                fVar239 = auVar88._0_4_;
                fVar238 = fVar238 * -0.5;
                auVar88 = local_6c0._0_16_;
              }
              fVar215 = auVar89._0_4_;
              auVar86 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar141 + fVar238 * fVar215 * fVar215 * fVar215)))
              ;
              auVar82 = vmulps_avx512vl(auVar88,auVar86);
              auVar89 = vdpps_avx(local_700._0_16_,auVar82,0x7f);
              fVar141 = auVar83._0_4_ + 1.0;
              auVar150._0_4_ = auVar89._0_4_ * auVar89._0_4_;
              auVar150._4_4_ = auVar89._4_4_ * auVar89._4_4_;
              auVar150._8_4_ = auVar89._8_4_ * auVar89._8_4_;
              auVar150._12_4_ = auVar89._12_4_ * auVar89._12_4_;
              auVar81 = vsubps_avx(local_620._0_16_,auVar150);
              fVar238 = auVar81._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar238;
              auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar90 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
              if (fVar238 < 0.0) {
                local_680._0_4_ = fVar141;
                local_7a0._0_4_ = fVar239;
                local_4f0._0_4_ = auVar90._0_4_;
                local_790 = auVar89;
                _local_510 = auVar86;
                local_500 = auVar82;
                local_4e0 = auVar85;
                fVar238 = sqrtf(fVar238);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar90 = ZEXT416((uint)local_4f0._0_4_);
                auVar83 = ZEXT416((uint)local_6e0._0_4_);
                auVar85 = local_4e0;
                auVar88 = local_6c0._0_16_;
                fVar141 = (float)local_680._0_4_;
                auVar89 = local_790;
                auVar82 = local_500;
                auVar86 = _local_510;
                fVar239 = (float)local_7a0._0_4_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar238 = auVar81._0_4_;
              }
              auVar249 = ZEXT1664(auVar88);
              auVar246 = ZEXT1664(local_620._0_16_);
              auVar257 = ZEXT3264(local_7c0);
              auVar250 = ZEXT3264(local_7e0);
              auVar251 = ZEXT3264(local_800);
              auVar252 = ZEXT3264(local_820);
              auVar253 = ZEXT3264(local_840);
              auVar254 = ZEXT3264(local_860);
              auVar255 = ZEXT3264(local_880);
              auVar256 = ZEXT3264(local_8a0);
              auVar258 = ZEXT3264(local_8c0);
              auVar259 = ZEXT3264(local_720);
              auVar260 = ZEXT3264(local_740);
              auVar262 = ZEXT3264(local_8e0);
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6a0._0_16_,
                                        local_900._0_16_);
              auVar92 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_6a0._0_16_);
              auVar81 = vshufps_avx(_local_580,_local_580,0x55);
              auVar190._0_4_ = auVar81._0_4_ * (float)local_600._0_4_;
              auVar190._4_4_ = auVar81._4_4_ * (float)local_600._4_4_;
              auVar190._8_4_ = auVar81._8_4_ * fStack_5f8;
              auVar190._12_4_ = auVar81._12_4_ * fStack_5f4;
              auVar209._0_4_ = auVar92._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar81 = vfmadd132ps_fma(auVar209,auVar190,local_5c0._0_16_);
              auVar174._0_4_ = auVar87._0_4_;
              auVar174._4_4_ = auVar174._0_4_;
              auVar174._8_4_ = auVar174._0_4_;
              auVar174._12_4_ = auVar174._0_4_;
              auVar81 = vfmadd132ps_fma(auVar174,auVar81,local_5e0._0_16_);
              auVar81 = vfmadd132ps_fma(_local_4a0,auVar81,local_5a0._0_16_);
              auVar175._0_4_ = auVar81._0_4_ * (float)local_4c0._0_4_;
              auVar175._4_4_ = auVar81._4_4_ * (float)local_4c0._0_4_;
              auVar175._8_4_ = auVar81._8_4_ * (float)local_4c0._0_4_;
              auVar175._12_4_ = auVar81._12_4_ * (float)local_4c0._0_4_;
              auVar81 = vdpps_avx(auVar88,auVar81,0x7f);
              fVar215 = auVar81._0_4_;
              auVar191._0_4_ = auVar88._0_4_ * fVar215;
              auVar191._4_4_ = auVar88._4_4_ * fVar215;
              auVar191._8_4_ = auVar88._8_4_ * fVar215;
              auVar191._12_4_ = auVar88._12_4_ * fVar215;
              auVar81 = vsubps_avx(auVar175,auVar191);
              fVar215 = auVar84._0_4_ * (float)local_4d0._0_4_;
              auVar87 = vmaxss_avx(ZEXT416((uint)local_670._0_4_),
                                   ZEXT416((uint)(local_580._0_4_ * fVar233 * 1.9073486e-06)));
              auVar192._0_4_ = auVar81._0_4_ * fVar215;
              auVar192._4_4_ = auVar81._4_4_ * fVar215;
              auVar192._8_4_ = auVar81._8_4_ * fVar215;
              auVar192._12_4_ = auVar81._12_4_ * fVar215;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar88,auVar23);
              auVar86 = vmulps_avx512vl(auVar86,auVar192);
              auVar84 = vdpps_avx(auVar92,auVar82,0x7f);
              auVar81 = vfmadd213ss_fma(auVar83,ZEXT416((uint)local_670._0_4_),auVar87);
              auVar83 = vdpps_avx(local_700._0_16_,auVar86,0x7f);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar141),
                                        ZEXT416((uint)((float)local_670._0_4_ / fVar239)),auVar81);
              fVar141 = auVar84._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_560._0_16_,auVar82,0x7f);
              auVar84 = vdpps_avx(local_700._0_16_,auVar92,0x7f);
              auVar81 = vmulss_avx512f(auVar91,auVar85);
              auVar90 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar81._0_4_ *
                                                             auVar85._0_4_ * auVar85._0_4_)));
              auVar81 = vdpps_avx(local_700._0_16_,local_560._0_16_,0x7f);
              auVar82 = vfnmadd231ss_fma(auVar84,auVar89,ZEXT416((uint)fVar141));
              auVar81 = vfnmadd231ss_fma(auVar81,auVar89,auVar83);
              auVar84 = vpermilps_avx(local_480._0_16_,0xff);
              fVar238 = fVar238 - auVar84._0_4_;
              auVar85 = vshufps_avx(auVar88,auVar88,0xff);
              auVar84 = vfmsub213ss_fma(auVar82,auVar90,auVar85);
              auVar236._8_4_ = 0x80000000;
              auVar236._0_8_ = 0x8000000080000000;
              auVar236._12_4_ = 0x80000000;
              auVar237 = ZEXT1664(auVar236);
              auVar229._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar84._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar232 = ZEXT1664(auVar229);
              auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar90._0_4_));
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar141),auVar81);
              auVar84 = vinsertps_avx(auVar229,auVar81,0x1c);
              auVar223._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar223._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar223._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar141),auVar223,0x10);
              auVar210._0_4_ = auVar82._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar83 = vdivps_avx(auVar84,auVar210);
              auVar84 = vdivps_avx(auVar81,auVar210);
              fVar141 = auVar89._0_4_;
              auVar225 = ZEXT1664(CONCAT412(fVar238,CONCAT48(fVar238,CONCAT44(fVar238,fVar238))));
              auVar211._0_4_ = fVar141 * auVar83._0_4_ + fVar238 * auVar84._0_4_;
              auVar211._4_4_ = fVar141 * auVar83._4_4_ + fVar238 * auVar84._4_4_;
              auVar211._8_4_ = fVar141 * auVar83._8_4_ + fVar238 * auVar84._8_4_;
              auVar211._12_4_ = fVar141 * auVar83._12_4_ + fVar238 * auVar84._12_4_;
              auVar83 = vsubps_avx(_local_580,auVar211);
              auVar240 = ZEXT1664(auVar83);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(auVar89,auVar24);
            } while (auVar86._0_4_ <= auVar84._0_4_);
            auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar87._0_4_)),local_520,
                                      ZEXT416(0x36000000));
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar89 = vandps_avx512vl(ZEXT416((uint)fVar238),auVar25);
          } while (auVar84._0_4_ <= auVar89._0_4_);
          fVar233 = auVar83._0_4_ + (float)local_530._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar233) &&
             (fVar141 = (ray->super_RayK<1>).tfar, fVar233 <= fVar141)) {
            auVar84 = vmovshdup_avx(auVar83);
            fVar238 = auVar84._0_4_;
            if ((0.0 <= fVar238) && (fVar238 <= 1.0)) {
              auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_620._0_4_));
              fVar215 = auVar84._0_4_;
              fVar239 = local_620._0_4_ * -0.5;
              auVar225 = ZEXT464((uint)fVar239);
              pGVar3 = (context->scene->geometries).items[local_910].ptr;
              if ((pGVar3->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar239 = fVar215 * 1.5 + fVar239 * fVar215 * fVar215 * fVar215;
                auVar212._0_4_ = local_700._0_4_ * fVar239;
                auVar212._4_4_ = local_700._4_4_ * fVar239;
                auVar212._8_4_ = local_700._8_4_ * fVar239;
                auVar212._12_4_ = local_700._12_4_ * fVar239;
                auVar85 = vfmadd213ps_fma(auVar85,auVar212,auVar88);
                auVar84 = vshufps_avx(auVar212,auVar212,0xc9);
                auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
                auVar213._0_4_ = auVar212._0_4_ * auVar89._0_4_;
                auVar213._4_4_ = auVar212._4_4_ * auVar89._4_4_;
                auVar213._8_4_ = auVar212._8_4_ * auVar89._8_4_;
                auVar213._12_4_ = auVar212._12_4_ * auVar89._12_4_;
                auVar81 = vfmsub231ps_fma(auVar213,auVar88,auVar84);
                auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar89 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar225 = ZEXT1664(auVar89);
                auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                auVar151._0_4_ = auVar85._0_4_ * auVar81._0_4_;
                auVar151._4_4_ = auVar85._4_4_ * auVar81._4_4_;
                auVar151._8_4_ = auVar85._8_4_ * auVar81._8_4_;
                auVar151._12_4_ = auVar85._12_4_ * auVar81._12_4_;
                auVar81 = vfmsub231ps_fma(auVar151,auVar84,auVar89);
                auVar84 = vshufps_avx(auVar81,auVar81,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar233;
                  uVar15 = vmovlps_avx(auVar84);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar15;
                  (ray->Ng).field_0.field_0.z = auVar81._0_4_;
                  ray->u = fVar238;
                  ray->v = 0.0;
                  ray->primID = (uint)local_908;
                  ray->geomID = (uint)local_910;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_900._0_4_ = fVar141;
                  local_660 = vmovlps_avx(auVar84);
                  local_658 = auVar81._0_4_;
                  local_654 = fVar238;
                  local_650 = 0;
                  local_64c = (uint)local_908;
                  local_648 = (uint)local_910;
                  local_644 = context->user->instID[0];
                  local_640 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar233;
                  local_914 = -1;
                  local_780.valid = &local_914;
                  local_780.geometryUserPtr = pGVar3->userPtr;
                  local_780.context = context->user;
                  local_780.ray = (RTCRayN *)ray;
                  local_780.hit = (RTCHitN *)&local_660;
                  local_780.N = 1;
                  if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a958f1:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar225 = ZEXT1664(auVar225._0_16_);
                      auVar232 = ZEXT1664(auVar232._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      (*p_Var4)(&local_780);
                      auVar262 = ZEXT3264(local_8e0);
                      auVar260 = ZEXT3264(local_740);
                      auVar259 = ZEXT3264(local_720);
                      auVar258 = ZEXT3264(local_8c0);
                      auVar256 = ZEXT3264(local_8a0);
                      auVar255 = ZEXT3264(local_880);
                      auVar254 = ZEXT3264(local_860);
                      auVar253 = ZEXT3264(local_840);
                      auVar252 = ZEXT3264(local_820);
                      auVar251 = ZEXT3264(local_800);
                      auVar250 = ZEXT3264(local_7e0);
                      auVar257 = ZEXT3264(local_7c0);
                      if (*local_780.valid == 0) goto LAB_01a959ec;
                    }
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).components[0] =
                         *(float *)local_780.hit;
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_780.hit + 4);
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_780.hit + 8);
                    *(float *)((long)local_780.ray + 0x3c) = *(float *)(local_780.hit + 0xc);
                    *(float *)((long)local_780.ray + 0x40) = *(float *)(local_780.hit + 0x10);
                    *(float *)((long)local_780.ray + 0x44) = *(float *)(local_780.hit + 0x14);
                    *(float *)((long)local_780.ray + 0x48) = *(float *)(local_780.hit + 0x18);
                    *(float *)((long)local_780.ray + 0x4c) = *(float *)(local_780.hit + 0x1c);
                    *(float *)((long)local_780.ray + 0x50) = *(float *)(local_780.hit + 0x20);
                  }
                  else {
                    auVar225 = ZEXT1664(auVar89);
                    auVar232 = ZEXT1664(auVar229);
                    auVar237 = ZEXT1664(auVar236);
                    auVar240 = ZEXT1664(auVar83);
                    auVar246 = ZEXT1664(local_620._0_16_);
                    auVar249 = ZEXT1664(auVar88);
                    (*pGVar3->intersectionFilterN)(&local_780);
                    auVar262 = ZEXT3264(local_8e0);
                    auVar260 = ZEXT3264(local_740);
                    auVar259 = ZEXT3264(local_720);
                    auVar258 = ZEXT3264(local_8c0);
                    auVar256 = ZEXT3264(local_8a0);
                    auVar255 = ZEXT3264(local_880);
                    auVar254 = ZEXT3264(local_860);
                    auVar253 = ZEXT3264(local_840);
                    auVar252 = ZEXT3264(local_820);
                    auVar251 = ZEXT3264(local_800);
                    auVar250 = ZEXT3264(local_7e0);
                    auVar257 = ZEXT3264(local_7c0);
                    if (*local_780.valid != 0) goto LAB_01a958f1;
LAB_01a959ec:
                    (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                  }
                }
              }
            }
          }
LAB_01a95795:
          fVar141 = (ray->super_RayK<1>).tfar;
          auVar71._4_4_ = fStack_39c;
          auVar71._0_4_ = local_3a0;
          auVar71._8_4_ = fStack_398;
          auVar71._12_4_ = fStack_394;
          auVar71._16_4_ = fStack_390;
          auVar71._20_4_ = fStack_38c;
          auVar71._24_4_ = fStack_388;
          auVar71._28_4_ = fStack_384;
          fVar233 = (ray->super_RayK<1>).tfar;
          auVar36._4_4_ = fVar233;
          auVar36._0_4_ = fVar233;
          auVar36._8_4_ = fVar233;
          auVar36._12_4_ = fVar233;
          auVar36._16_4_ = fVar233;
          auVar36._20_4_ = fVar233;
          auVar36._24_4_ = fVar233;
          auVar36._28_4_ = fVar233;
          uVar15 = vcmpps_avx512vl(auVar71,auVar36,2);
          bVar76 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar76 & (byte)uVar15;
        }
        uVar18 = vpcmpd_avx512vl(local_360,local_2c0,1);
        uVar17 = vpcmpd_avx512vl(local_360,_local_400,1);
        auVar195._0_4_ = (float)local_420._0_4_ + (float)local_340._0_4_;
        auVar195._4_4_ = (float)local_420._4_4_ + (float)local_340._4_4_;
        auVar195._8_4_ = fStack_418 + fStack_338;
        auVar195._12_4_ = fStack_414 + fStack_334;
        auVar195._16_4_ = fStack_410 + fStack_330;
        auVar195._20_4_ = fStack_40c + fStack_32c;
        auVar195._24_4_ = fStack_408 + fStack_328;
        auVar195._28_4_ = fStack_404 + fStack_324;
        auVar214._4_4_ = fVar141;
        auVar214._0_4_ = fVar141;
        auVar214._8_4_ = fVar141;
        auVar214._12_4_ = fVar141;
        auVar214._16_4_ = fVar141;
        auVar214._20_4_ = fVar141;
        auVar214._24_4_ = fVar141;
        auVar214._28_4_ = fVar141;
        uVar15 = vcmpps_avx512vl(auVar195,auVar214,2);
        bVar76 = (byte)local_744 & (byte)uVar18 & (byte)uVar15;
        auVar196._0_4_ = (float)local_420._0_4_ + (float)local_300._0_4_;
        auVar196._4_4_ = (float)local_420._4_4_ + (float)local_300._4_4_;
        auVar196._8_4_ = fStack_418 + fStack_2f8;
        auVar196._12_4_ = fStack_414 + fStack_2f4;
        auVar196._16_4_ = fStack_410 + fStack_2f0;
        auVar196._20_4_ = fStack_40c + fStack_2ec;
        auVar196._24_4_ = fStack_408 + fStack_2e8;
        auVar196._28_4_ = fStack_404 + fStack_2e4;
        uVar15 = vcmpps_avx512vl(auVar196,auVar214,2);
        bVar72 = bVar72 & (byte)uVar17 & (byte)uVar15 | bVar76;
        prim = local_630;
        if (bVar72 != 0) {
          abStack_180[uVar75 * 0x60] = bVar72;
          bVar79 = (bool)(bVar76 >> 1 & 1);
          bVar5 = (bool)(bVar76 >> 2 & 1);
          bVar6 = (bool)(bVar76 >> 3 & 1);
          bVar7 = (bool)(bVar76 >> 4 & 1);
          bVar8 = (bool)(bVar76 >> 5 & 1);
          bVar9 = (bool)(bVar76 >> 6 & 1);
          auStack_160[uVar75 * 0x18] =
               (uint)(bVar76 & 1) * local_340._0_4_ | (uint)!(bool)(bVar76 & 1) * local_300._0_4_;
          auStack_160[uVar75 * 0x18 + 1] =
               (uint)bVar79 * local_340._4_4_ | (uint)!bVar79 * local_300._4_4_;
          auStack_160[uVar75 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_338 | (uint)!bVar5 * (int)fStack_2f8;
          auStack_160[uVar75 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_334 | (uint)!bVar6 * (int)fStack_2f4;
          auStack_160[uVar75 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_330 | (uint)!bVar7 * (int)fStack_2f0;
          auStack_160[uVar75 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_32c | (uint)!bVar8 * (int)fStack_2ec;
          auStack_160[uVar75 * 0x18 + 6] =
               (uint)bVar9 * (int)fStack_328 | (uint)!bVar9 * (int)fStack_2e8;
          auStack_160[uVar75 * 0x18 + 7] =
               (uint)(bVar76 >> 7) * (int)fStack_324 | (uint)!(bool)(bVar76 >> 7) * (int)fStack_2e4;
          uVar77 = vmovlps_avx(local_370);
          (&uStack_140)[uVar75 * 0xc] = uVar77;
          aiStack_138[uVar75 * 0x18] = local_74c + 1;
          uVar75 = (ulong)((int)uVar75 + 1);
        }
      }
    }
    fVar233 = (ray->super_RayK<1>).tfar;
    auVar154._4_4_ = fVar233;
    auVar154._0_4_ = fVar233;
    auVar154._8_4_ = fVar233;
    auVar154._12_4_ = fVar233;
    auVar154._16_4_ = fVar233;
    auVar154._20_4_ = fVar233;
    auVar154._24_4_ = fVar233;
    auVar154._28_4_ = fVar233;
    do {
      uVar80 = (uint)uVar75;
      uVar75 = (ulong)(uVar80 - 1);
      if (uVar80 == 0) {
        uVar15 = vcmpps_avx512vl(auVar154,local_2a0,0xd);
        local_628 = (ulong)((uint)local_628 & (uint)uVar15);
        goto LAB_01a93255;
      }
      auVar98 = *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x18);
      auVar193._0_4_ = auVar98._0_4_ + (float)local_420._0_4_;
      auVar193._4_4_ = auVar98._4_4_ + (float)local_420._4_4_;
      auVar193._8_4_ = auVar98._8_4_ + fStack_418;
      auVar193._12_4_ = auVar98._12_4_ + fStack_414;
      auVar193._16_4_ = auVar98._16_4_ + fStack_410;
      auVar193._20_4_ = auVar98._20_4_ + fStack_40c;
      auVar193._24_4_ = auVar98._24_4_ + fStack_408;
      auVar193._28_4_ = auVar98._28_4_ + fStack_404;
      uVar15 = vcmpps_avx512vl(auVar193,auVar154,2);
      uVar134 = (uint)uVar15 & (uint)abStack_180[uVar75 * 0x60];
    } while (uVar134 == 0);
    uVar77 = (&uStack_140)[uVar75 * 0xc];
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar77;
    auVar194._8_4_ = 0x7f800000;
    auVar194._0_8_ = 0x7f8000007f800000;
    auVar194._12_4_ = 0x7f800000;
    auVar194._16_4_ = 0x7f800000;
    auVar194._20_4_ = 0x7f800000;
    auVar194._24_4_ = 0x7f800000;
    auVar194._28_4_ = 0x7f800000;
    auVar96 = vblendmps_avx512vl(auVar194,auVar98);
    bVar72 = (byte)uVar134;
    auVar131._0_4_ =
         (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar98._0_4_;
    bVar79 = (bool)((byte)(uVar134 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * (int)auVar98._4_4_;
    bVar79 = (bool)((byte)(uVar134 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * (int)auVar98._8_4_;
    bVar79 = (bool)((byte)(uVar134 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * (int)auVar98._12_4_;
    bVar79 = (bool)((byte)(uVar134 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * (int)auVar98._16_4_;
    bVar79 = (bool)((byte)(uVar134 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * (int)auVar98._20_4_;
    bVar79 = (bool)((byte)(uVar134 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * (int)auVar98._24_4_;
    auVar131._28_4_ =
         (uVar134 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar134 >> 7,0) * (int)auVar98._28_4_;
    auVar98 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar98 = vminps_avx(auVar131,auVar98);
    auVar96 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar96);
    auVar96 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar96);
    uVar15 = vcmpps_avx512vl(auVar131,auVar98,0);
    bVar76 = (byte)uVar15 & bVar72;
    if (bVar76 != 0) {
      uVar134 = (uint)bVar76;
    }
    uVar135 = 0;
    for (; (uVar134 & 1) == 0; uVar134 = uVar134 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_74c = aiStack_138[uVar75 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar72;
    abStack_180[uVar75 * 0x60] = bVar72;
    if (bVar72 == 0) {
      uVar80 = uVar80 - 1;
    }
    uVar143 = (undefined4)uVar77;
    auVar176._4_4_ = uVar143;
    auVar176._0_4_ = uVar143;
    auVar176._8_4_ = uVar143;
    auVar176._12_4_ = uVar143;
    auVar176._16_4_ = uVar143;
    auVar176._20_4_ = uVar143;
    auVar176._24_4_ = uVar143;
    auVar176._28_4_ = uVar143;
    auVar83 = vmovshdup_avx(auVar145);
    auVar83 = vsubps_avx(auVar83,auVar145);
    auVar155._0_4_ = auVar83._0_4_;
    auVar155._4_4_ = auVar155._0_4_;
    auVar155._8_4_ = auVar155._0_4_;
    auVar155._12_4_ = auVar155._0_4_;
    auVar155._16_4_ = auVar155._0_4_;
    auVar155._20_4_ = auVar155._0_4_;
    auVar155._24_4_ = auVar155._0_4_;
    auVar155._28_4_ = auVar155._0_4_;
    auVar83 = vfmadd132ps_fma(auVar155,auVar176,_DAT_01f7b040);
    _local_340 = ZEXT1632(auVar83);
    local_370._8_8_ = 0;
    local_370._0_8_ = *(ulong *)(local_340 + (ulong)uVar135 * 4);
    uVar75 = (ulong)uVar80;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }